

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_eval_simd.h
# Opt level: O3

vboolf_impl<4> __thiscall
embree::sse2::
PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
::eval(PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
       *this,vboolf_impl<4> *valid,Ref This,vfloat_impl<4> *u,vfloat_impl<4> *v,float dscale,
      size_t depth)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  size_t i_3;
  long lVar13;
  float *pfVar14;
  vfloat_impl<4> *pvVar15;
  long lVar16;
  uint *puVar17;
  uint *puVar18;
  size_t extraout_RDX;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *pDVar20;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  long lVar21;
  size_t sVar22;
  DynamicStackArray<float,_16UL,_64UL> *pDVar23;
  undefined1 (*pauVar24) [16];
  uint *puVar25;
  uint *puVar26;
  uint *puVar27;
  uint *puVar28;
  size_t i;
  long lVar29;
  ulong uVar30;
  size_t i_2;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  float fVar34;
  float fVar35;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar41;
  float fVar42;
  undefined1 auVar36 [16];
  float *pfVar40;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar46 [16];
  float fVar57;
  float fVar61;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar62;
  float fVar63;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar74;
  float fVar78;
  float fVar79;
  undefined1 auVar75 [16];
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar89;
  float fVar91;
  float fVar93;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar90;
  float fVar92;
  float fVar94;
  undefined1 auVar88 [16];
  float fVar95;
  float fVar96;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar104;
  float fVar105;
  undefined1 auVar97 [16];
  float fVar103;
  float fVar106;
  float fVar107;
  undefined1 auVar98 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float fVar113;
  float fVar119;
  float fVar121;
  undefined1 in_XMM7 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar120;
  float fVar122;
  float fVar124;
  float fVar125;
  undefined1 auVar117 [16];
  float fVar123;
  float fVar126;
  undefined1 auVar118 [16];
  undefined1 auVar127 [16];
  float fVar128;
  float fVar129;
  float fVar135;
  float fVar137;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar136;
  float fVar138;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  uint uVar139;
  float fVar140;
  uint uVar143;
  float fVar144;
  uint uVar145;
  float fVar146;
  float fVar147;
  uint uVar148;
  float fVar149;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar150;
  float fVar151;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar159;
  undefined1 auVar154 [16];
  float fVar160;
  uint uVar161;
  uint uVar163;
  uint uVar164;
  undefined1 auVar162 [16];
  float fVar165;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar166 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  vboolf_impl<4> vVar173;
  size_t in_stack_00000008;
  CatmullClarkPatch patch;
  undefined8 local_e50;
  undefined8 uStack_e48;
  anon_union_32_2_4062524c_for_Vec2<embree::vfloat_impl<4>_>_1 local_de0;
  FeatureAdaptiveEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
  local_dc0;
  CatmullClarkPatch local_d80;
  Ref RVar19;
  
  RVar19.ptr = This.ptr;
  if (u == (vfloat_impl<4> *)0x0) {
switchD_00d4e254_caseD_5:
    pfVar14 = (float *)mm_lookupmask_ps._0_8_;
    pfVar40 = (float *)mm_lookupmask_ps._8_8_;
    goto LAB_00d50d32;
  }
  RVar19.ptr = in_stack_00000008;
  switch((uint)u & 0xf) {
  case 1:
    uVar32 = (ulong)u & 0xfffffffffffffff0;
    puVar28 = *(uint **)&valid->field_0;
    lVar13 = *(long *)((long)&valid->field_0 + 8);
    lVar31 = *(long *)&valid[1].field_0;
    lVar16 = *(long *)((long)&valid[1].field_0 + 8);
    lVar9 = *(long *)&valid[2].field_0;
    RVar19.ptr = *(size_t *)((long)&valid[2].field_0 + 8);
    lVar10 = *(long *)&valid[3].field_0;
    lVar11 = *(long *)((long)&valid[3].field_0 + 8);
    if (lVar11 != 0 && puVar28 != (uint *)0x0) {
      lVar21 = 0;
      do {
        fVar74 = *(float *)(uVar32 + lVar21 * 4);
        fVar78 = *(float *)(uVar32 + 0x10 + lVar21 * 4) - fVar74;
        fVar80 = (v->field_0).v[1];
        fVar82 = (v->field_0).v[2];
        fVar95 = (v->field_0).v[3];
        fVar34 = fVar78 * (v->field_0).v[0] + fVar74;
        fVar37 = fVar78 * fVar80 + fVar74;
        fVar39 = fVar78 * fVar82 + fVar74;
        fVar74 = fVar78 * fVar95 + fVar74;
        fVar78 = *(float *)(uVar32 + 0x30 + lVar21 * 4);
        fVar41 = *(float *)(uVar32 + 0x20 + lVar21 * 4) - fVar78;
        fVar99 = *(float *)(depth + 4);
        fVar101 = *(float *)(depth + 8);
        fVar104 = *(float *)(depth + 0xc);
        uVar161 = *(uint *)(This.ptr + 4);
        uVar163 = *(uint *)(This.ptr + 8);
        uVar164 = *(uint *)(This.ptr + 0xc);
        *puVar28 = ~*(uint *)This.ptr & *puVar28 |
                   (uint)(((fVar41 * (v->field_0).v[0] + fVar78) - fVar34) * *(float *)depth +
                         fVar34) & *(uint *)This.ptr;
        puVar28[1] = ~uVar161 & puVar28[1] |
                     (uint)(((fVar41 * fVar80 + fVar78) - fVar37) * fVar99 + fVar37) & uVar161;
        puVar28[2] = ~uVar163 & puVar28[2] |
                     (uint)(((fVar41 * fVar82 + fVar78) - fVar39) * fVar101 + fVar39) & uVar163;
        puVar28[3] = ~uVar164 & puVar28[3] |
                     (uint)(((fVar41 * fVar95 + fVar78) - fVar74) * fVar104 + fVar74) & uVar164;
        lVar21 = lVar21 + 1;
        puVar28 = puVar28 + lVar10;
      } while (lVar11 != lVar21);
    }
    if (lVar13 != 0 && lVar11 != 0) {
      lVar21 = 0;
      lVar29 = 0;
      do {
        fVar95 = *(float *)(uVar32 + 0x10 + lVar29 * 4) - *(float *)(uVar32 + lVar29 * 4);
        fVar82 = (*(float *)(uVar32 + 0x20 + lVar29 * 4) - *(float *)(uVar32 + 0x30 + lVar29 * 4)) -
                 fVar95;
        fVar74 = *(float *)(depth + 4);
        fVar78 = *(float *)(depth + 8);
        fVar80 = *(float *)(depth + 0xc);
        uVar161 = *(uint *)(This.ptr + 4);
        uVar163 = *(uint *)(This.ptr + 8);
        uVar164 = *(uint *)(This.ptr + 0xc);
        puVar28 = (uint *)(lVar13 + lVar21 * 4);
        uVar139 = puVar28[1];
        uVar143 = puVar28[2];
        uVar145 = puVar28[3];
        puVar27 = (uint *)(lVar13 + lVar21 * 4);
        *puVar27 = ~*(uint *)This.ptr & *puVar28 |
                   (uint)((fVar82 * *(float *)depth + fVar95) * dscale) & *(uint *)This.ptr;
        puVar27[1] = ~uVar161 & uVar139 | (uint)((fVar82 * fVar74 + fVar95) * dscale) & uVar161;
        puVar27[2] = ~uVar163 & uVar143 | (uint)((fVar82 * fVar78 + fVar95) * dscale) & uVar163;
        puVar27[3] = ~uVar164 & uVar145 | (uint)((fVar82 * fVar80 + fVar95) * dscale) & uVar164;
        fVar95 = *(float *)(uVar32 + 0x30 + lVar29 * 4) - *(float *)(uVar32 + lVar29 * 4);
        fVar82 = (*(float *)(uVar32 + 0x20 + lVar29 * 4) - *(float *)(uVar32 + 0x10 + lVar29 * 4)) -
                 fVar95;
        fVar74 = (v->field_0).v[1];
        fVar78 = (v->field_0).v[2];
        fVar80 = (v->field_0).v[3];
        uVar161 = *(uint *)(This.ptr + 4);
        uVar163 = *(uint *)(This.ptr + 8);
        uVar164 = *(uint *)(This.ptr + 0xc);
        puVar28 = (uint *)(lVar31 + lVar21 * 4);
        uVar139 = puVar28[1];
        uVar143 = puVar28[2];
        uVar145 = puVar28[3];
        puVar27 = (uint *)(lVar31 + lVar21 * 4);
        *puVar27 = ~*(uint *)This.ptr & *puVar28 |
                   (uint)((fVar82 * (v->field_0).v[0] + fVar95) * dscale) & *(uint *)This.ptr;
        puVar27[1] = ~uVar161 & uVar139 | (uint)((fVar82 * fVar74 + fVar95) * dscale) & uVar161;
        puVar27[2] = ~uVar163 & uVar143 | (uint)((fVar82 * fVar78 + fVar95) * dscale) & uVar163;
        puVar27[3] = ~uVar164 & uVar145 | (uint)((fVar82 * fVar80 + fVar95) * dscale) & uVar164;
        lVar29 = lVar29 + 1;
        lVar21 = lVar21 + lVar10;
      } while (lVar11 != lVar29);
    }
    if (lVar16 != 0 && lVar11 != 0) {
      fVar74 = dscale * dscale * 0.0;
      lVar13 = 0;
      lVar31 = 0;
      do {
        uVar161 = *(uint *)(This.ptr + 4);
        uVar163 = *(uint *)(This.ptr + 8);
        uVar164 = *(uint *)(This.ptr + 0xc);
        puVar28 = (uint *)(lVar16 + lVar13 * 4);
        uVar139 = puVar28[1];
        uVar143 = puVar28[2];
        uVar145 = puVar28[3];
        puVar27 = (uint *)(lVar16 + lVar13 * 4);
        *puVar27 = ~*(uint *)This.ptr & *puVar28 | *(uint *)This.ptr & (uint)fVar74;
        puVar27[1] = ~uVar161 & uVar139 | uVar161 & (uint)fVar74;
        puVar27[2] = ~uVar163 & uVar143 | uVar163 & (uint)fVar74;
        puVar27[3] = ~uVar164 & uVar145 | uVar164 & (uint)fVar74;
        uVar161 = *(uint *)(This.ptr + 4);
        uVar163 = *(uint *)(This.ptr + 8);
        uVar164 = *(uint *)(This.ptr + 0xc);
        puVar28 = (uint *)(lVar9 + lVar13 * 4);
        uVar139 = puVar28[1];
        uVar143 = puVar28[2];
        uVar145 = puVar28[3];
        puVar27 = (uint *)(lVar9 + lVar13 * 4);
        *puVar27 = ~*(uint *)This.ptr & *puVar28 | *(uint *)This.ptr & (uint)fVar74;
        puVar27[1] = ~uVar161 & uVar139 | uVar161 & (uint)fVar74;
        puVar27[2] = ~uVar163 & uVar143 | uVar163 & (uint)fVar74;
        puVar27[3] = ~uVar164 & uVar145 | uVar164 & (uint)fVar74;
        fVar78 = ((*(float *)(uVar32 + 0x20 + lVar31 * 4) - *(float *)(uVar32 + 0x30 + lVar31 * 4))
                 - (*(float *)(uVar32 + 0x10 + lVar31 * 4) - *(float *)(uVar32 + lVar31 * 4))) *
                 dscale * dscale;
        uVar161 = *(uint *)(This.ptr + 4);
        uVar163 = *(uint *)(This.ptr + 8);
        uVar164 = *(uint *)(This.ptr + 0xc);
        puVar28 = (uint *)(RVar19.ptr + lVar13 * 4);
        uVar139 = puVar28[1];
        uVar143 = puVar28[2];
        uVar145 = puVar28[3];
        puVar27 = (uint *)(RVar19.ptr + lVar13 * 4);
        *puVar27 = ~*(uint *)This.ptr & *puVar28 | (uint)fVar78 & *(uint *)This.ptr;
        puVar27[1] = ~uVar161 & uVar139 | (uint)fVar78 & uVar161;
        puVar27[2] = ~uVar163 & uVar143 | (uint)fVar78 & uVar163;
        puVar27[3] = ~uVar164 & uVar145 | (uint)fVar78 & uVar164;
        lVar31 = lVar31 + 1;
        lVar13 = lVar13 + lVar10;
      } while (lVar11 != lVar31);
    }
    break;
  case 2:
    BSplinePatchT<embree::vfloat_impl<4>,embree::vfloat_impl<4>>::
    eval<embree::vboolf_impl<4>,embree::vfloat_impl<4>>
              ((BSplinePatchT<embree::vfloat_impl<4>,embree::vfloat_impl<4>> *)
               ((ulong)u & 0xfffffffffffffff0),(vboolf_impl<4> *)This.ptr,v,(vfloat_impl<4> *)depth,
               *(float **)&valid->field_0,*(float **)((long)&valid->field_0 + 8),
               *(float **)&valid[1].field_0,*(float **)((long)&valid[1].field_0 + 8),
               *(float **)&valid[2].field_0,*(float **)((long)&valid[2].field_0 + 8),dscale,
               *(size_t *)&valid[3].field_0,*(size_t *)((long)&valid[3].field_0 + 8));
    RVar19.ptr = extraout_RDX;
    break;
  case 3:
    uVar32 = (ulong)u & 0xfffffffffffffff0;
    puVar28 = *(uint **)&valid->field_0;
    puVar27 = *(uint **)((long)&valid->field_0 + 8);
    puVar26 = *(uint **)&valid[1].field_0;
    puVar25 = *(uint **)((long)&valid[1].field_0 + 8);
    puVar18 = *(uint **)&valid[2].field_0;
    puVar17 = *(uint **)((long)&valid[2].field_0 + 8);
    lVar13 = *(long *)&valid[3].field_0;
    RVar19.ptr = *(size_t *)((long)&valid[3].field_0 + 8);
    if ((puVar28 != (uint *)0x0) && (RVar19.ptr != 0)) {
      fVar74 = (v->field_0).v[0];
      fVar78 = (v->field_0).v[1];
      fVar80 = (v->field_0).v[2];
      fVar82 = (v->field_0).v[3];
      fVar43 = 1.0 - fVar74;
      fVar54 = 1.0 - fVar78;
      fVar62 = 1.0 - fVar80;
      fVar71 = 1.0 - fVar82;
      fVar95 = *(float *)depth;
      fVar99 = *(float *)(depth + 4);
      fVar101 = *(float *)(depth + 8);
      fVar104 = *(float *)(depth + 0xc);
      fVar83 = 1.0 - fVar95;
      fVar89 = 1.0 - fVar99;
      fVar91 = 1.0 - fVar101;
      fVar93 = 1.0 - fVar104;
      fVar34 = fVar95 * fVar95 * 3.0 * fVar83;
      fVar37 = fVar99 * fVar99 * 3.0 * fVar89;
      fVar39 = fVar101 * fVar101 * 3.0 * fVar91;
      fVar41 = fVar104 * fVar104 * 3.0 * fVar93;
      fVar51 = fVar83 * fVar83 * fVar83;
      fVar58 = fVar89 * fVar89 * fVar89;
      fVar70 = fVar91 * fVar91 * fVar91;
      fVar72 = fVar93 * fVar93 * fVar93;
      fVar83 = fVar95 * 3.0 * fVar83 * fVar83;
      fVar89 = fVar99 * 3.0 * fVar89 * fVar89;
      fVar91 = fVar101 * 3.0 * fVar91 * fVar91;
      fVar93 = fVar104 * 3.0 * fVar93 * fVar93;
      fVar95 = fVar95 * fVar95 * fVar95;
      fVar99 = fVar99 * fVar99 * fVar99;
      fVar101 = fVar101 * fVar101 * fVar101;
      fVar104 = fVar104 * fVar104 * fVar104;
      sVar22 = 0;
      do {
        fVar112 = *(float *)(uVar32 + sVar22 * 4);
        fVar119 = *(float *)(uVar32 + 0x10 + sVar22 * 4);
        fVar121 = *(float *)(uVar32 + 0x20 + sVar22 * 4);
        fVar124 = *(float *)(uVar32 + 0x30 + sVar22 * 4);
        fVar128 = *(float *)(uVar32 + 0x40 + sVar22 * 4);
        fVar135 = *(float *)(uVar32 + 0x80 + sVar22 * 4);
        fVar96 = *(float *)(uVar32 + 0xc0 + sVar22 * 4);
        fVar100 = *(float *)(uVar32 + 0x50 + sVar22 * 4);
        fVar102 = *(float *)(uVar32 + 0x60 + sVar22 * 4);
        fVar105 = *(float *)(uVar32 + 0x90 + sVar22 * 4);
        fVar146 = *(float *)(uVar32 + 0xd0 + sVar22 * 4);
        fVar149 = *(float *)(uVar32 + 0xa0 + sVar22 * 4);
        fVar165 = *(float *)(uVar32 + 0xe0 + sVar22 * 4);
        fVar167 = *(float *)(uVar32 + 0x70 + sVar22 * 4);
        fVar168 = *(float *)(uVar32 + 0xb0 + sVar22 * 4);
        fVar169 = *(float *)(uVar32 + 0xf0 + sVar22 * 4);
        uVar161 = *(uint *)(This.ptr + 4);
        uVar163 = *(uint *)(This.ptr + 8);
        uVar164 = *(uint *)(This.ptr + 0xc);
        *puVar28 = ~*(uint *)This.ptr & *puVar28 |
                   (uint)((fVar169 * fVar95 + fVar168 * fVar34 + fVar167 * fVar83 + fVar124 * fVar51
                          ) * fVar74 * fVar74 * fVar74 +
                         (fVar165 * fVar95 + fVar149 * fVar34 + fVar102 * fVar83 + fVar121 * fVar51)
                         * fVar74 * fVar74 * 3.0 * fVar43 +
                         (fVar146 * fVar95 + fVar105 * fVar34 + fVar100 * fVar83 + fVar119 * fVar51)
                         * fVar74 * 3.0 * fVar43 * fVar43 +
                         (fVar96 * fVar95 + fVar135 * fVar34 + fVar128 * fVar83 + fVar112 * fVar51)
                         * fVar43 * fVar43 * fVar43) & *(uint *)This.ptr;
        puVar28[1] = ~uVar161 & puVar28[1] |
                     (uint)((fVar169 * fVar99 +
                            fVar168 * fVar37 + fVar167 * fVar89 + fVar124 * fVar58) *
                            fVar78 * fVar78 * fVar78 +
                           (fVar165 * fVar99 +
                           fVar149 * fVar37 + fVar102 * fVar89 + fVar121 * fVar58) *
                           fVar78 * fVar78 * 3.0 * fVar54 +
                           (fVar146 * fVar99 +
                           fVar105 * fVar37 + fVar100 * fVar89 + fVar119 * fVar58) *
                           fVar78 * 3.0 * fVar54 * fVar54 +
                           (fVar96 * fVar99 + fVar135 * fVar37 + fVar128 * fVar89 + fVar112 * fVar58
                           ) * fVar54 * fVar54 * fVar54) & uVar161;
        puVar28[2] = ~uVar163 & puVar28[2] |
                     (uint)((fVar169 * fVar101 +
                            fVar168 * fVar39 + fVar167 * fVar91 + fVar124 * fVar70) *
                            fVar80 * fVar80 * fVar80 +
                           (fVar165 * fVar101 +
                           fVar149 * fVar39 + fVar102 * fVar91 + fVar121 * fVar70) *
                           fVar80 * fVar80 * 3.0 * fVar62 +
                           (fVar146 * fVar101 +
                           fVar105 * fVar39 + fVar100 * fVar91 + fVar119 * fVar70) *
                           fVar80 * 3.0 * fVar62 * fVar62 +
                           (fVar96 * fVar101 +
                           fVar135 * fVar39 + fVar128 * fVar91 + fVar112 * fVar70) *
                           fVar62 * fVar62 * fVar62) & uVar163;
        puVar28[3] = ~uVar164 & puVar28[3] |
                     (uint)((fVar169 * fVar104 +
                            fVar168 * fVar41 + fVar167 * fVar93 + fVar124 * fVar72) *
                            fVar82 * fVar82 * fVar82 +
                           (fVar165 * fVar104 +
                           fVar149 * fVar41 + fVar102 * fVar93 + fVar121 * fVar72) *
                           fVar82 * fVar82 * 3.0 * fVar71 +
                           (fVar146 * fVar104 +
                           fVar105 * fVar41 + fVar100 * fVar93 + fVar119 * fVar72) *
                           fVar82 * 3.0 * fVar71 * fVar71 +
                           (fVar96 * fVar104 +
                           fVar135 * fVar41 + fVar128 * fVar93 + fVar112 * fVar72) *
                           fVar71 * fVar71 * fVar71) & uVar164;
        sVar22 = sVar22 + 1;
        puVar28 = puVar28 + lVar13;
      } while (RVar19.ptr != sVar22);
    }
    if (puVar27 != (uint *)0x0) {
      fVar74 = (v->field_0).v[0];
      fVar78 = (v->field_0).v[1];
      fVar80 = (v->field_0).v[2];
      fVar82 = (v->field_0).v[3];
      fVar102 = 1.0 - fVar74;
      fVar105 = 1.0 - fVar78;
      fVar146 = 1.0 - fVar80;
      fVar149 = 1.0 - fVar82;
      fVar62 = fVar102 * fVar102;
      fVar70 = fVar105 * fVar105;
      fVar71 = fVar146 * fVar146;
      fVar72 = fVar149 * fVar149;
      fVar83 = fVar74 * fVar74;
      fVar89 = fVar78 * fVar78;
      fVar91 = fVar80 * fVar80;
      fVar93 = fVar82 * fVar82;
      fVar34 = fVar83 * 3.0;
      fVar37 = fVar89 * 3.0;
      fVar39 = fVar91 * 3.0;
      fVar41 = fVar93 * 3.0;
      fVar95 = *(float *)depth;
      fVar99 = *(float *)(depth + 4);
      fVar101 = *(float *)(depth + 8);
      fVar104 = *(float *)(depth + 0xc);
      fVar165 = 1.0 - fVar95;
      fVar167 = 1.0 - fVar99;
      fVar168 = 1.0 - fVar101;
      fVar169 = 1.0 - fVar104;
      fVar112 = fVar165 * fVar165;
      fVar119 = fVar167 * fVar167;
      fVar121 = fVar168 * fVar168;
      fVar124 = fVar169 * fVar169;
      fVar128 = fVar95 * fVar95;
      fVar135 = fVar99 * fVar99;
      fVar96 = fVar101 * fVar101;
      fVar100 = fVar104 * fVar104;
      fVar43 = fVar128 * 3.0;
      fVar51 = fVar135 * 3.0;
      fVar54 = fVar96 * 3.0;
      fVar58 = fVar100 * 3.0;
      if (RVar19.ptr != 0) {
        fVar74 = fVar74 * fVar102 + fVar74 * fVar102;
        fVar78 = fVar78 * fVar105 + fVar78 * fVar105;
        fVar80 = fVar80 * fVar146 + fVar80 * fVar146;
        fVar82 = fVar82 * fVar149 + fVar82 * fVar149;
        fVar102 = fVar165 * fVar112;
        fVar105 = fVar167 * fVar119;
        fVar146 = fVar168 * fVar121;
        fVar149 = fVar169 * fVar124;
        fVar112 = fVar95 * 3.0 * fVar112;
        fVar119 = fVar99 * 3.0 * fVar119;
        fVar121 = fVar101 * 3.0 * fVar121;
        fVar124 = fVar104 * 3.0 * fVar124;
        fVar43 = fVar43 * fVar165;
        fVar51 = fVar51 * fVar167;
        fVar54 = fVar54 * fVar168;
        fVar58 = fVar58 * fVar169;
        fVar128 = fVar128 * fVar95;
        fVar135 = fVar135 * fVar99;
        fVar96 = fVar96 * fVar101;
        fVar100 = fVar100 * fVar104;
        sVar22 = 0;
        do {
          fVar95 = *(float *)(uVar32 + sVar22 * 4);
          fVar99 = *(float *)(uVar32 + 0x10 + sVar22 * 4);
          fVar101 = *(float *)(uVar32 + 0x20 + sVar22 * 4);
          fVar104 = *(float *)(uVar32 + 0x30 + sVar22 * 4);
          fVar165 = *(float *)(uVar32 + 0x40 + sVar22 * 4);
          fVar167 = *(float *)(uVar32 + 0x80 + sVar22 * 4);
          fVar168 = *(float *)(uVar32 + 0x50 + sVar22 * 4);
          fVar169 = *(float *)(uVar32 + 0x60 + sVar22 * 4);
          fVar150 = *(float *)(uVar32 + 0xc0 + sVar22 * 4);
          fVar155 = *(float *)(uVar32 + 0x90 + sVar22 * 4);
          fVar157 = *(float *)(uVar32 + 0xa0 + sVar22 * 4);
          fVar159 = *(float *)(uVar32 + 0xd0 + sVar22 * 4);
          fVar123 = *(float *)(uVar32 + 0xe0 + sVar22 * 4);
          fVar126 = *(float *)(uVar32 + 0x70 + sVar22 * 4);
          fVar4 = *(float *)(uVar32 + 0xb0 + sVar22 * 4);
          fVar5 = *(float *)(uVar32 + 0xf0 + sVar22 * 4);
          uVar161 = *(uint *)(This.ptr + 4);
          uVar163 = *(uint *)(This.ptr + 8);
          uVar164 = *(uint *)(This.ptr + 0xc);
          *puVar27 = ~*(uint *)This.ptr & *puVar27 |
                     (uint)(((fVar5 * fVar128 +
                             fVar4 * fVar43 + fVar126 * fVar112 + fVar104 * fVar102) * fVar34 +
                            (fVar123 * fVar128 +
                            fVar157 * fVar43 + fVar169 * fVar112 + fVar101 * fVar102) *
                            (fVar74 - fVar83) * 3.0 +
                            ((fVar159 * fVar128 +
                             fVar155 * fVar43 + fVar168 * fVar112 + fVar99 * fVar102) *
                             (fVar62 - fVar74) * 3.0 -
                            (fVar150 * fVar128 +
                            fVar167 * fVar43 + fVar165 * fVar112 + fVar95 * fVar102) * fVar62 * 3.0)
                            ) * dscale) & *(uint *)This.ptr;
          puVar27[1] = ~uVar161 & puVar27[1] |
                       (uint)(((fVar5 * fVar135 +
                               fVar4 * fVar51 + fVar126 * fVar119 + fVar104 * fVar105) * fVar37 +
                              (fVar123 * fVar135 +
                              fVar157 * fVar51 + fVar169 * fVar119 + fVar101 * fVar105) *
                              (fVar78 - fVar89) * 3.0 +
                              ((fVar159 * fVar135 +
                               fVar155 * fVar51 + fVar168 * fVar119 + fVar99 * fVar105) *
                               (fVar70 - fVar78) * 3.0 -
                              (fVar150 * fVar135 +
                              fVar167 * fVar51 + fVar165 * fVar119 + fVar95 * fVar105) *
                              fVar70 * 3.0)) * dscale) & uVar161;
          puVar27[2] = ~uVar163 & puVar27[2] |
                       (uint)(((fVar5 * fVar96 +
                               fVar4 * fVar54 + fVar126 * fVar121 + fVar104 * fVar146) * fVar39 +
                              (fVar123 * fVar96 +
                              fVar157 * fVar54 + fVar169 * fVar121 + fVar101 * fVar146) *
                              (fVar80 - fVar91) * 3.0 +
                              ((fVar159 * fVar96 +
                               fVar155 * fVar54 + fVar168 * fVar121 + fVar99 * fVar146) *
                               (fVar71 - fVar80) * 3.0 -
                              (fVar150 * fVar96 +
                              fVar167 * fVar54 + fVar165 * fVar121 + fVar95 * fVar146) *
                              fVar71 * 3.0)) * dscale) & uVar163;
          puVar27[3] = ~uVar164 & puVar27[3] |
                       (uint)(((fVar5 * fVar100 +
                               fVar4 * fVar58 + fVar126 * fVar124 + fVar104 * fVar149) * fVar41 +
                              (fVar123 * fVar100 +
                              fVar157 * fVar58 + fVar169 * fVar124 + fVar101 * fVar149) *
                              (fVar82 - fVar93) * 3.0 +
                              ((fVar159 * fVar100 +
                               fVar155 * fVar58 + fVar168 * fVar124 + fVar99 * fVar149) *
                               (fVar72 - fVar82) * 3.0 -
                              (fVar150 * fVar100 +
                              fVar167 * fVar58 + fVar165 * fVar124 + fVar95 * fVar149) *
                              fVar72 * 3.0)) * dscale) & uVar164;
          sVar22 = sVar22 + 1;
          puVar27 = puVar27 + lVar13;
        } while (RVar19.ptr != sVar22);
        fVar74 = (v->field_0).v[0];
        fVar78 = (v->field_0).v[1];
        fVar80 = (v->field_0).v[2];
        fVar82 = (v->field_0).v[3];
        fVar95 = *(float *)depth;
        fVar99 = *(float *)(depth + 4);
        fVar101 = *(float *)(depth + 8);
        fVar104 = *(float *)(depth + 0xc);
        fVar102 = 1.0 - fVar74;
        fVar105 = 1.0 - fVar78;
        fVar146 = 1.0 - fVar80;
        fVar149 = 1.0 - fVar82;
        fVar62 = fVar102 * fVar102;
        fVar70 = fVar105 * fVar105;
        fVar71 = fVar146 * fVar146;
        fVar72 = fVar149 * fVar149;
        fVar83 = fVar74 * fVar74;
        fVar89 = fVar78 * fVar78;
        fVar91 = fVar80 * fVar80;
        fVar93 = fVar82 * fVar82;
        fVar34 = fVar83 * 3.0;
        fVar37 = fVar89 * 3.0;
        fVar39 = fVar91 * 3.0;
        fVar41 = fVar93 * 3.0;
        fVar165 = 1.0 - fVar95;
        fVar167 = 1.0 - fVar99;
        fVar168 = 1.0 - fVar101;
        fVar169 = 1.0 - fVar104;
        fVar112 = fVar165 * fVar165;
        fVar119 = fVar167 * fVar167;
        fVar121 = fVar168 * fVar168;
        fVar124 = fVar169 * fVar169;
        fVar128 = fVar95 * fVar95;
        fVar135 = fVar99 * fVar99;
        fVar96 = fVar101 * fVar101;
        fVar100 = fVar104 * fVar104;
        fVar43 = fVar128 * 3.0;
        fVar51 = fVar135 * 3.0;
        fVar54 = fVar96 * 3.0;
        fVar58 = fVar100 * 3.0;
      }
      if (RVar19.ptr != 0) {
        fVar95 = fVar95 * fVar165 + fVar95 * fVar165;
        fVar99 = fVar99 * fVar167 + fVar99 * fVar167;
        fVar101 = fVar101 * fVar168 + fVar101 * fVar168;
        fVar104 = fVar104 * fVar169 + fVar104 * fVar169;
        fVar165 = fVar112 * -3.0;
        fVar167 = fVar119 * -3.0;
        fVar168 = fVar121 * -3.0;
        fVar169 = fVar124 * -3.0;
        fVar112 = (fVar112 - fVar95) * 3.0;
        fVar119 = (fVar119 - fVar99) * 3.0;
        fVar121 = (fVar121 - fVar101) * 3.0;
        fVar124 = (fVar124 - fVar104) * 3.0;
        fVar95 = (fVar95 - fVar128) * 3.0;
        fVar99 = (fVar99 - fVar135) * 3.0;
        fVar101 = (fVar101 - fVar96) * 3.0;
        fVar104 = (fVar104 - fVar100) * 3.0;
        sVar22 = 0;
        do {
          fVar128 = *(float *)(uVar32 + sVar22 * 4);
          fVar135 = *(float *)(uVar32 + 0x10 + sVar22 * 4);
          fVar96 = *(float *)(uVar32 + 0x20 + sVar22 * 4);
          fVar100 = *(float *)(uVar32 + 0x30 + sVar22 * 4);
          fVar150 = *(float *)(uVar32 + 0x40 + sVar22 * 4);
          fVar155 = *(float *)(uVar32 + 0x80 + sVar22 * 4);
          fVar157 = *(float *)(uVar32 + 0x50 + sVar22 * 4);
          fVar159 = *(float *)(uVar32 + 0x60 + sVar22 * 4);
          fVar123 = *(float *)(uVar32 + 0xc0 + sVar22 * 4);
          fVar126 = *(float *)(uVar32 + 0x90 + sVar22 * 4);
          fVar4 = *(float *)(uVar32 + 0xa0 + sVar22 * 4);
          fVar5 = *(float *)(uVar32 + 0xd0 + sVar22 * 4);
          fVar6 = *(float *)(uVar32 + 0xe0 + sVar22 * 4);
          fVar7 = *(float *)(uVar32 + 0x70 + sVar22 * 4);
          fVar8 = *(float *)(uVar32 + 0xb0 + sVar22 * 4);
          fVar44 = *(float *)(uVar32 + 0xf0 + sVar22 * 4);
          uVar161 = *(uint *)(This.ptr + 4);
          uVar163 = *(uint *)(This.ptr + 8);
          uVar164 = *(uint *)(This.ptr + 0xc);
          *puVar26 = ~*(uint *)This.ptr & *puVar26 |
                     (uint)(((fVar44 * fVar43 + fVar8 * fVar95 + fVar7 * fVar112 + fVar100 * fVar165
                             ) * fVar83 * fVar74 +
                            (fVar6 * fVar43 + fVar4 * fVar95 + fVar159 * fVar112 + fVar96 * fVar165)
                            * fVar34 * fVar102 +
                            (fVar5 * fVar43 +
                            fVar126 * fVar95 + fVar157 * fVar112 + fVar135 * fVar165) *
                            fVar74 * 3.0 * fVar62 +
                            (fVar123 * fVar43 +
                            fVar155 * fVar95 + fVar150 * fVar112 + fVar128 * fVar165) *
                            fVar102 * fVar62) * dscale) & *(uint *)This.ptr;
          puVar26[1] = ~uVar161 & puVar26[1] |
                       (uint)(((fVar44 * fVar51 +
                               fVar8 * fVar99 + fVar7 * fVar119 + fVar100 * fVar167) *
                               fVar89 * fVar78 +
                              (fVar6 * fVar51 +
                              fVar4 * fVar99 + fVar159 * fVar119 + fVar96 * fVar167) *
                              fVar37 * fVar105 +
                              (fVar5 * fVar51 +
                              fVar126 * fVar99 + fVar157 * fVar119 + fVar135 * fVar167) *
                              fVar78 * 3.0 * fVar70 +
                              (fVar123 * fVar51 +
                              fVar155 * fVar99 + fVar150 * fVar119 + fVar128 * fVar167) *
                              fVar105 * fVar70) * dscale) & uVar161;
          puVar26[2] = ~uVar163 & puVar26[2] |
                       (uint)(((fVar44 * fVar54 +
                               fVar8 * fVar101 + fVar7 * fVar121 + fVar100 * fVar168) *
                               fVar91 * fVar80 +
                              (fVar6 * fVar54 +
                              fVar4 * fVar101 + fVar159 * fVar121 + fVar96 * fVar168) *
                              fVar39 * fVar146 +
                              (fVar5 * fVar54 +
                              fVar126 * fVar101 + fVar157 * fVar121 + fVar135 * fVar168) *
                              fVar80 * 3.0 * fVar71 +
                              (fVar123 * fVar54 +
                              fVar155 * fVar101 + fVar150 * fVar121 + fVar128 * fVar168) *
                              fVar146 * fVar71) * dscale) & uVar163;
          puVar26[3] = ~uVar164 & puVar26[3] |
                       (uint)(((fVar44 * fVar58 +
                               fVar8 * fVar104 + fVar7 * fVar124 + fVar100 * fVar169) *
                               fVar93 * fVar82 +
                              (fVar6 * fVar58 +
                              fVar4 * fVar104 + fVar159 * fVar124 + fVar96 * fVar169) *
                              fVar41 * fVar149 +
                              (fVar5 * fVar58 +
                              fVar126 * fVar104 + fVar157 * fVar124 + fVar135 * fVar169) *
                              fVar82 * 3.0 * fVar72 +
                              (fVar123 * fVar58 +
                              fVar155 * fVar104 + fVar150 * fVar124 + fVar128 * fVar169) *
                              fVar149 * fVar72) * dscale) & uVar164;
          sVar22 = sVar22 + 1;
          puVar26 = puVar26 + lVar13;
        } while (RVar19.ptr != sVar22);
      }
    }
    if (puVar25 != (uint *)0x0) {
      fVar74 = (v->field_0).v[0];
      fVar78 = (v->field_0).v[1];
      fVar80 = (v->field_0).v[2];
      fVar82 = (v->field_0).v[3];
      fVar43 = 1.0 - fVar74;
      fVar51 = 1.0 - fVar78;
      fVar54 = 1.0 - fVar80;
      fVar58 = 1.0 - fVar82;
      fVar95 = *(float *)depth;
      fVar99 = *(float *)(depth + 4);
      fVar101 = *(float *)(depth + 8);
      fVar104 = *(float *)(depth + 0xc);
      fVar34 = 1.0 - fVar95;
      fVar37 = 1.0 - fVar99;
      fVar39 = 1.0 - fVar101;
      fVar41 = 1.0 - fVar104;
      if (RVar19.ptr != 0) {
        fVar83 = fVar34 * fVar34 * fVar34;
        fVar89 = fVar37 * fVar37 * fVar37;
        fVar91 = fVar39 * fVar39 * fVar39;
        fVar93 = fVar41 * fVar41 * fVar41;
        fVar112 = fVar95 * 3.0 * fVar34 * fVar34;
        fVar119 = fVar99 * 3.0 * fVar37 * fVar37;
        fVar121 = fVar101 * 3.0 * fVar39 * fVar39;
        fVar124 = fVar104 * 3.0 * fVar41 * fVar41;
        fVar62 = fVar95 * fVar95 * fVar95;
        fVar70 = fVar99 * fVar99 * fVar99;
        fVar71 = fVar101 * fVar101 * fVar101;
        fVar72 = fVar104 * fVar104 * fVar104;
        fVar34 = fVar95 * fVar95 * 3.0 * fVar34;
        fVar37 = fVar99 * fVar99 * 3.0 * fVar37;
        fVar39 = fVar101 * fVar101 * 3.0 * fVar39;
        fVar41 = fVar104 * fVar104 * 3.0 * fVar41;
        fVar95 = dscale * dscale;
        sVar22 = 0;
        do {
          fVar99 = *(float *)(uVar32 + sVar22 * 4);
          fVar101 = *(float *)(uVar32 + 0x10 + sVar22 * 4);
          fVar104 = *(float *)(uVar32 + 0x20 + sVar22 * 4);
          fVar128 = *(float *)(uVar32 + 0x30 + sVar22 * 4);
          fVar135 = *(float *)(uVar32 + 0x40 + sVar22 * 4);
          fVar96 = *(float *)(uVar32 + 0x80 + sVar22 * 4);
          fVar100 = *(float *)(uVar32 + 0x50 + sVar22 * 4);
          fVar102 = *(float *)(uVar32 + 0x60 + sVar22 * 4);
          fVar105 = *(float *)(uVar32 + 0xc0 + sVar22 * 4);
          fVar146 = *(float *)(uVar32 + 0x90 + sVar22 * 4);
          fVar149 = *(float *)(uVar32 + 0xa0 + sVar22 * 4);
          fVar165 = *(float *)(uVar32 + 0xd0 + sVar22 * 4);
          fVar167 = *(float *)(uVar32 + 0xe0 + sVar22 * 4);
          fVar168 = *(float *)(uVar32 + 0x70 + sVar22 * 4);
          fVar169 = *(float *)(uVar32 + 0xb0 + sVar22 * 4);
          fVar150 = *(float *)(uVar32 + 0xf0 + sVar22 * 4);
          uVar161 = *(uint *)(This.ptr + 4);
          uVar163 = *(uint *)(This.ptr + 8);
          uVar164 = *(uint *)(This.ptr + 0xc);
          *puVar25 = ~*(uint *)This.ptr & *puVar25 |
                     (uint)(((fVar150 * fVar62 +
                             fVar169 * fVar34 + fVar168 * fVar112 + fVar128 * fVar83) * fVar74 * 6.0
                            + (fVar167 * fVar62 +
                              fVar149 * fVar34 + fVar102 * fVar112 + fVar104 * fVar83) *
                              (fVar43 - (fVar74 + fVar74)) * 6.0 +
                              (fVar165 * fVar62 +
                              fVar146 * fVar34 + fVar100 * fVar112 + fVar101 * fVar83) *
                              (fVar74 - (fVar43 + fVar43)) * 6.0 +
                              (fVar105 * fVar62 +
                              fVar96 * fVar34 + fVar135 * fVar112 + fVar99 * fVar83) * fVar43 * 6.0)
                           * fVar95) & *(uint *)This.ptr;
          puVar25[1] = ~uVar161 & puVar25[1] |
                       (uint)(((fVar150 * fVar70 +
                               fVar169 * fVar37 + fVar168 * fVar119 + fVar128 * fVar89) *
                               fVar78 * 6.0 +
                              (fVar167 * fVar70 +
                              fVar149 * fVar37 + fVar102 * fVar119 + fVar104 * fVar89) *
                              (fVar51 - (fVar78 + fVar78)) * 6.0 +
                              (fVar165 * fVar70 +
                              fVar146 * fVar37 + fVar100 * fVar119 + fVar101 * fVar89) *
                              (fVar78 - (fVar51 + fVar51)) * 6.0 +
                              (fVar105 * fVar70 +
                              fVar96 * fVar37 + fVar135 * fVar119 + fVar99 * fVar89) * fVar51 * 6.0)
                             * fVar95) & uVar161;
          puVar25[2] = ~uVar163 & puVar25[2] |
                       (uint)(((fVar150 * fVar71 +
                               fVar169 * fVar39 + fVar168 * fVar121 + fVar128 * fVar91) *
                               fVar80 * 6.0 +
                              (fVar167 * fVar71 +
                              fVar149 * fVar39 + fVar102 * fVar121 + fVar104 * fVar91) *
                              (fVar54 - (fVar80 + fVar80)) * 6.0 +
                              (fVar165 * fVar71 +
                              fVar146 * fVar39 + fVar100 * fVar121 + fVar101 * fVar91) *
                              (fVar80 - (fVar54 + fVar54)) * 6.0 +
                              (fVar105 * fVar71 +
                              fVar96 * fVar39 + fVar135 * fVar121 + fVar99 * fVar91) * fVar54 * 6.0)
                             * fVar95) & uVar163;
          puVar25[3] = ~uVar164 & puVar25[3] |
                       (uint)(((fVar150 * fVar72 +
                               fVar169 * fVar41 + fVar168 * fVar124 + fVar128 * fVar93) *
                               fVar82 * 6.0 +
                              (fVar167 * fVar72 +
                              fVar149 * fVar41 + fVar102 * fVar124 + fVar104 * fVar93) *
                              (fVar58 - (fVar82 + fVar82)) * 6.0 +
                              (fVar165 * fVar72 +
                              fVar146 * fVar41 + fVar100 * fVar124 + fVar101 * fVar93) *
                              (fVar82 - (fVar58 + fVar58)) * 6.0 +
                              (fVar105 * fVar72 +
                              fVar96 * fVar41 + fVar135 * fVar124 + fVar99 * fVar93) * fVar58 * 6.0)
                             * fVar95) & uVar164;
          sVar22 = sVar22 + 1;
          puVar25 = puVar25 + lVar13;
        } while (RVar19.ptr != sVar22);
        fVar74 = (v->field_0).v[0];
        fVar78 = (v->field_0).v[1];
        fVar80 = (v->field_0).v[2];
        fVar82 = (v->field_0).v[3];
        fVar95 = *(float *)depth;
        fVar99 = *(float *)(depth + 4);
        fVar101 = *(float *)(depth + 8);
        fVar104 = *(float *)(depth + 0xc);
        fVar43 = 1.0 - fVar74;
        fVar51 = 1.0 - fVar78;
        fVar54 = 1.0 - fVar80;
        fVar58 = 1.0 - fVar82;
        fVar34 = 1.0 - fVar95;
        fVar37 = 1.0 - fVar99;
        fVar39 = 1.0 - fVar101;
        fVar41 = 1.0 - fVar104;
      }
      fVar83 = fVar43 * fVar43;
      fVar89 = fVar51 * fVar51;
      fVar91 = fVar54 * fVar54;
      fVar93 = fVar58 * fVar58;
      fVar112 = fVar74 * fVar74;
      fVar119 = fVar78 * fVar78;
      fVar121 = fVar80 * fVar80;
      fVar124 = fVar82 * fVar82;
      fVar62 = fVar112 * 3.0;
      fVar70 = fVar119 * 3.0;
      fVar71 = fVar121 * 3.0;
      fVar72 = fVar124 * 3.0;
      if (RVar19.ptr != 0) {
        fVar102 = fVar34 * 6.0;
        fVar105 = fVar37 * 6.0;
        fVar146 = fVar39 * 6.0;
        fVar149 = fVar41 * 6.0;
        fVar128 = (fVar95 - (fVar34 + fVar34)) * 6.0;
        fVar135 = (fVar99 - (fVar37 + fVar37)) * 6.0;
        fVar96 = (fVar101 - (fVar39 + fVar39)) * 6.0;
        fVar100 = (fVar104 - (fVar41 + fVar41)) * 6.0;
        fVar34 = (fVar34 - (fVar95 + fVar95)) * 6.0;
        fVar37 = (fVar37 - (fVar99 + fVar99)) * 6.0;
        fVar39 = (fVar39 - (fVar101 + fVar101)) * 6.0;
        fVar41 = (fVar41 - (fVar104 + fVar104)) * 6.0;
        fVar95 = fVar95 * 6.0;
        fVar99 = fVar99 * 6.0;
        fVar101 = fVar101 * 6.0;
        fVar104 = fVar104 * 6.0;
        fVar165 = dscale * dscale;
        sVar22 = 0;
        do {
          fVar167 = *(float *)(uVar32 + sVar22 * 4);
          fVar168 = *(float *)(uVar32 + 0x10 + sVar22 * 4);
          fVar169 = *(float *)(uVar32 + 0x20 + sVar22 * 4);
          fVar150 = *(float *)(uVar32 + 0x30 + sVar22 * 4);
          fVar155 = *(float *)(uVar32 + 0x40 + sVar22 * 4);
          fVar157 = *(float *)(uVar32 + 0x80 + sVar22 * 4);
          fVar159 = *(float *)(uVar32 + 0x50 + sVar22 * 4);
          fVar123 = *(float *)(uVar32 + 0x60 + sVar22 * 4);
          fVar126 = *(float *)(uVar32 + 0xc0 + sVar22 * 4);
          fVar4 = *(float *)(uVar32 + 0x90 + sVar22 * 4);
          fVar5 = *(float *)(uVar32 + 0xa0 + sVar22 * 4);
          fVar6 = *(float *)(uVar32 + 0xd0 + sVar22 * 4);
          fVar7 = *(float *)(uVar32 + 0xe0 + sVar22 * 4);
          fVar8 = *(float *)(uVar32 + 0x70 + sVar22 * 4);
          fVar44 = *(float *)(uVar32 + 0xb0 + sVar22 * 4);
          fVar52 = *(float *)(uVar32 + 0xf0 + sVar22 * 4);
          uVar161 = *(uint *)(This.ptr + 4);
          uVar163 = *(uint *)(This.ptr + 8);
          uVar164 = *(uint *)(This.ptr + 0xc);
          *puVar18 = ~*(uint *)This.ptr & *puVar18 |
                     (uint)(((fVar52 * fVar95 +
                             fVar44 * fVar34 + fVar8 * fVar128 + fVar150 * fVar102) *
                             fVar112 * fVar74 +
                            (fVar7 * fVar95 + fVar5 * fVar34 + fVar123 * fVar128 + fVar169 * fVar102
                            ) * fVar62 * fVar43 +
                            (fVar6 * fVar95 + fVar4 * fVar34 + fVar159 * fVar128 + fVar168 * fVar102
                            ) * fVar74 * 3.0 * fVar83 +
                            (fVar126 * fVar95 +
                            fVar157 * fVar34 + fVar155 * fVar128 + fVar167 * fVar102) *
                            fVar43 * fVar83) * fVar165) & *(uint *)This.ptr;
          puVar18[1] = ~uVar161 & puVar18[1] |
                       (uint)(((fVar52 * fVar99 +
                               fVar44 * fVar37 + fVar8 * fVar135 + fVar150 * fVar105) *
                               fVar119 * fVar78 +
                              (fVar7 * fVar99 +
                              fVar5 * fVar37 + fVar123 * fVar135 + fVar169 * fVar105) *
                              fVar70 * fVar51 +
                              (fVar6 * fVar99 +
                              fVar4 * fVar37 + fVar159 * fVar135 + fVar168 * fVar105) *
                              fVar78 * 3.0 * fVar89 +
                              (fVar126 * fVar99 +
                              fVar157 * fVar37 + fVar155 * fVar135 + fVar167 * fVar105) *
                              fVar51 * fVar89) * fVar165) & uVar161;
          puVar18[2] = ~uVar163 & puVar18[2] |
                       (uint)(((fVar52 * fVar101 +
                               fVar44 * fVar39 + fVar8 * fVar96 + fVar150 * fVar146) *
                               fVar121 * fVar80 +
                              (fVar7 * fVar101 +
                              fVar5 * fVar39 + fVar123 * fVar96 + fVar169 * fVar146) *
                              fVar71 * fVar54 +
                              (fVar6 * fVar101 +
                              fVar4 * fVar39 + fVar159 * fVar96 + fVar168 * fVar146) *
                              fVar80 * 3.0 * fVar91 +
                              (fVar126 * fVar101 +
                              fVar157 * fVar39 + fVar155 * fVar96 + fVar167 * fVar146) *
                              fVar54 * fVar91) * fVar165) & uVar163;
          puVar18[3] = ~uVar164 & puVar18[3] |
                       (uint)(((fVar52 * fVar104 +
                               fVar44 * fVar41 + fVar8 * fVar100 + fVar150 * fVar149) *
                               fVar124 * fVar82 +
                              (fVar7 * fVar104 +
                              fVar5 * fVar41 + fVar123 * fVar100 + fVar169 * fVar149) *
                              fVar72 * fVar58 +
                              (fVar6 * fVar104 +
                              fVar4 * fVar41 + fVar159 * fVar100 + fVar168 * fVar149) *
                              fVar82 * 3.0 * fVar93 +
                              (fVar126 * fVar104 +
                              fVar157 * fVar41 + fVar155 * fVar100 + fVar167 * fVar149) *
                              fVar58 * fVar93) * fVar165) & uVar164;
          sVar22 = sVar22 + 1;
          puVar18 = puVar18 + lVar13;
        } while (RVar19.ptr != sVar22);
        fVar74 = (v->field_0).v[0];
        fVar78 = (v->field_0).v[1];
        fVar80 = (v->field_0).v[2];
        fVar82 = (v->field_0).v[3];
        fVar95 = *(float *)depth;
        fVar99 = *(float *)(depth + 4);
        fVar101 = *(float *)(depth + 8);
        fVar104 = *(float *)(depth + 0xc);
        fVar43 = 1.0 - fVar74;
        fVar51 = 1.0 - fVar78;
        fVar54 = 1.0 - fVar80;
        fVar58 = 1.0 - fVar82;
        fVar83 = fVar43 * fVar43;
        fVar89 = fVar51 * fVar51;
        fVar91 = fVar54 * fVar54;
        fVar93 = fVar58 * fVar58;
        fVar112 = fVar74 * fVar74;
        fVar119 = fVar78 * fVar78;
        fVar121 = fVar80 * fVar80;
        fVar124 = fVar82 * fVar82;
        fVar62 = fVar112 * 3.0;
        fVar70 = fVar119 * 3.0;
        fVar71 = fVar121 * 3.0;
        fVar72 = fVar124 * 3.0;
        fVar34 = 1.0 - fVar95;
        fVar37 = 1.0 - fVar99;
        fVar39 = 1.0 - fVar101;
        fVar41 = 1.0 - fVar104;
      }
      if (RVar19.ptr != 0) {
        fVar43 = fVar74 * fVar43 + fVar74 * fVar43;
        fVar51 = fVar78 * fVar51 + fVar78 * fVar51;
        fVar54 = fVar80 * fVar54 + fVar80 * fVar54;
        fVar58 = fVar82 * fVar58 + fVar82 * fVar58;
        fVar74 = fVar95 * fVar34 + fVar95 * fVar34;
        fVar78 = fVar99 * fVar37 + fVar99 * fVar37;
        fVar80 = fVar101 * fVar39 + fVar101 * fVar39;
        fVar82 = fVar104 * fVar41 + fVar104 * fVar41;
        fVar128 = fVar34 * fVar34 * -3.0;
        fVar135 = fVar37 * fVar37 * -3.0;
        fVar96 = fVar39 * fVar39 * -3.0;
        fVar100 = fVar41 * fVar41 * -3.0;
        fVar102 = (fVar34 * fVar34 - fVar74) * 3.0;
        fVar105 = (fVar37 * fVar37 - fVar78) * 3.0;
        fVar146 = (fVar39 * fVar39 - fVar80) * 3.0;
        fVar149 = (fVar41 * fVar41 - fVar82) * 3.0;
        fVar34 = (fVar74 - fVar95 * fVar95) * 3.0;
        fVar37 = (fVar78 - fVar99 * fVar99) * 3.0;
        fVar39 = (fVar80 - fVar101 * fVar101) * 3.0;
        fVar41 = (fVar82 - fVar104 * fVar104) * 3.0;
        fVar74 = fVar95 * fVar95 * 3.0;
        fVar78 = fVar99 * fVar99 * 3.0;
        fVar80 = fVar101 * fVar101 * 3.0;
        fVar82 = fVar104 * fVar104 * 3.0;
        fVar95 = dscale * dscale;
        sVar22 = 0;
        do {
          fVar99 = *(float *)(uVar32 + sVar22 * 4);
          fVar101 = *(float *)(uVar32 + 0x10 + sVar22 * 4);
          fVar104 = *(float *)(uVar32 + 0x20 + sVar22 * 4);
          fVar165 = *(float *)(uVar32 + 0x30 + sVar22 * 4);
          fVar167 = *(float *)(uVar32 + 0x40 + sVar22 * 4);
          fVar168 = *(float *)(uVar32 + 0x80 + sVar22 * 4);
          fVar169 = *(float *)(uVar32 + 0x50 + sVar22 * 4);
          fVar150 = *(float *)(uVar32 + 0x60 + sVar22 * 4);
          fVar155 = *(float *)(uVar32 + 0xc0 + sVar22 * 4);
          fVar157 = *(float *)(uVar32 + 0x90 + sVar22 * 4);
          fVar159 = *(float *)(uVar32 + 0xa0 + sVar22 * 4);
          fVar123 = *(float *)(uVar32 + 0xd0 + sVar22 * 4);
          fVar126 = *(float *)(uVar32 + 0xe0 + sVar22 * 4);
          fVar4 = *(float *)(uVar32 + 0x70 + sVar22 * 4);
          fVar5 = *(float *)(uVar32 + 0xb0 + sVar22 * 4);
          fVar6 = *(float *)(uVar32 + 0xf0 + sVar22 * 4);
          uVar161 = *(uint *)(This.ptr + 4);
          uVar163 = *(uint *)(This.ptr + 8);
          uVar164 = *(uint *)(This.ptr + 0xc);
          *puVar17 = ~*(uint *)This.ptr & *puVar17 |
                     (uint)(((fVar6 * fVar74 + fVar5 * fVar34 + fVar4 * fVar102 + fVar165 * fVar128)
                             * fVar62 +
                            (fVar126 * fVar74 +
                            fVar159 * fVar34 + fVar150 * fVar102 + fVar104 * fVar128) *
                            (fVar43 - fVar112) * 3.0 +
                            ((fVar123 * fVar74 +
                             fVar157 * fVar34 + fVar169 * fVar102 + fVar101 * fVar128) *
                             (fVar83 - fVar43) * 3.0 -
                            (fVar155 * fVar74 +
                            fVar168 * fVar34 + fVar167 * fVar102 + fVar99 * fVar128) * fVar83 * 3.0)
                            ) * fVar95) & *(uint *)This.ptr;
          puVar17[1] = ~uVar161 & puVar17[1] |
                       (uint)(((fVar6 * fVar78 +
                               fVar5 * fVar37 + fVar4 * fVar105 + fVar165 * fVar135) * fVar70 +
                              (fVar126 * fVar78 +
                              fVar159 * fVar37 + fVar150 * fVar105 + fVar104 * fVar135) *
                              (fVar51 - fVar119) * 3.0 +
                              ((fVar123 * fVar78 +
                               fVar157 * fVar37 + fVar169 * fVar105 + fVar101 * fVar135) *
                               (fVar89 - fVar51) * 3.0 -
                              (fVar155 * fVar78 +
                              fVar168 * fVar37 + fVar167 * fVar105 + fVar99 * fVar135) *
                              fVar89 * 3.0)) * fVar95) & uVar161;
          puVar17[2] = ~uVar163 & puVar17[2] |
                       (uint)(((fVar6 * fVar80 + fVar5 * fVar39 + fVar4 * fVar146 + fVar165 * fVar96
                               ) * fVar71 +
                              (fVar126 * fVar80 +
                              fVar159 * fVar39 + fVar150 * fVar146 + fVar104 * fVar96) *
                              (fVar54 - fVar121) * 3.0 +
                              ((fVar123 * fVar80 +
                               fVar157 * fVar39 + fVar169 * fVar146 + fVar101 * fVar96) *
                               (fVar91 - fVar54) * 3.0 -
                              (fVar155 * fVar80 +
                              fVar168 * fVar39 + fVar167 * fVar146 + fVar99 * fVar96) * fVar91 * 3.0
                              )) * fVar95) & uVar163;
          puVar17[3] = ~uVar164 & puVar17[3] |
                       (uint)(((fVar6 * fVar82 +
                               fVar5 * fVar41 + fVar4 * fVar149 + fVar165 * fVar100) * fVar72 +
                              (fVar126 * fVar82 +
                              fVar159 * fVar41 + fVar150 * fVar149 + fVar104 * fVar100) *
                              (fVar58 - fVar124) * 3.0 +
                              ((fVar123 * fVar82 +
                               fVar157 * fVar41 + fVar169 * fVar149 + fVar101 * fVar100) *
                               (fVar93 - fVar58) * 3.0 -
                              (fVar155 * fVar82 +
                              fVar168 * fVar41 + fVar167 * fVar149 + fVar99 * fVar100) *
                              fVar93 * 3.0)) * fVar95) & uVar164;
          sVar22 = sVar22 + 1;
          puVar17 = puVar17 + lVar13;
        } while (RVar19.ptr != sVar22);
      }
    }
    break;
  case 4:
    uVar32 = (ulong)u & 0xfffffffffffffff0;
    puVar28 = *(uint **)&valid->field_0;
    puVar27 = *(uint **)((long)&valid->field_0 + 8);
    puVar26 = *(uint **)&valid[1].field_0;
    puVar25 = *(uint **)((long)&valid[1].field_0 + 8);
    pauVar24 = *(undefined1 (**) [16])&valid[2].field_0;
    puVar18 = *(uint **)((long)&valid[2].field_0 + 8);
    lVar13 = *(long *)&valid[3].field_0;
    RVar19.ptr = *(size_t *)((long)&valid[3].field_0 + 8);
    if ((puVar28 != (uint *)0x0) && (RVar19.ptr != 0)) {
      fVar74 = (v->field_0).v[0];
      fVar78 = (v->field_0).v[1];
      fVar80 = (v->field_0).v[2];
      fVar82 = (v->field_0).v[3];
      fVar34 = 1.0 - fVar74;
      fVar37 = 1.0 - fVar78;
      fVar39 = 1.0 - fVar80;
      fVar41 = 1.0 - fVar82;
      fVar95 = *(float *)depth;
      fVar99 = *(float *)(depth + 4);
      fVar101 = *(float *)(depth + 8);
      fVar104 = *(float *)(depth + 0xc);
      fVar43 = 1.0 - fVar95;
      fVar51 = 1.0 - fVar99;
      fVar54 = 1.0 - fVar101;
      fVar58 = 1.0 - fVar104;
      fVar83 = fVar95 * fVar95 * 3.0 * fVar43;
      fVar89 = fVar99 * fVar99 * 3.0 * fVar51;
      fVar91 = fVar101 * fVar101 * 3.0 * fVar54;
      fVar93 = fVar104 * fVar104 * 3.0 * fVar58;
      fVar62 = fVar43 * fVar43 * fVar43;
      fVar70 = fVar51 * fVar51 * fVar51;
      fVar71 = fVar54 * fVar54 * fVar54;
      fVar72 = fVar58 * fVar58 * fVar58;
      fVar43 = fVar95 * 3.0 * fVar43 * fVar43;
      fVar51 = fVar99 * 3.0 * fVar51 * fVar51;
      fVar54 = fVar101 * 3.0 * fVar54 * fVar54;
      fVar58 = fVar104 * 3.0 * fVar58 * fVar58;
      fVar95 = fVar95 * fVar95 * fVar95;
      fVar99 = fVar99 * fVar99 * fVar99;
      fVar101 = fVar101 * fVar101 * fVar101;
      fVar104 = fVar104 * fVar104 * fVar104;
      sVar22 = 0;
      do {
        fVar159 = (v->field_0).v[0];
        fVar123 = (v->field_0).v[1];
        fVar126 = (v->field_0).v[2];
        fVar4 = (v->field_0).v[3];
        fVar5 = *(float *)depth;
        fVar6 = *(float *)(depth + 4);
        fVar7 = *(float *)(depth + 8);
        fVar8 = *(float *)(depth + 0xc);
        fVar112 = *(float *)(uVar32 + 0x50 + sVar22 * 4);
        fVar119 = *(float *)(uVar32 + 0x60 + sVar22 * 4);
        fVar121 = *(float *)(uVar32 + 0xa0 + sVar22 * 4);
        fVar124 = *(float *)(uVar32 + 0x100 + sVar22 * 4);
        fVar128 = *(float *)(uVar32 + 0x110 + sVar22 * 4);
        fVar135 = *(float *)(uVar32 + 0x130 + sVar22 * 4);
        fVar96 = 1.0 - fVar159;
        fVar100 = 1.0 - fVar123;
        fVar102 = 1.0 - fVar126;
        fVar105 = 1.0 - fVar4;
        fVar44 = 1.0 - fVar5;
        fVar52 = 1.0 - fVar6;
        fVar55 = 1.0 - fVar7;
        fVar59 = 1.0 - fVar8;
        uVar139 = -(uint)((fVar159 != 0.0 && fVar159 != 1.0) && (fVar5 != 0.0 && fVar5 != 1.0));
        uVar143 = -(uint)((fVar123 != 0.0 && fVar123 != 1.0) && (fVar6 != 0.0 && fVar6 != 1.0));
        uVar145 = -(uint)((fVar126 != 0.0 && fVar126 != 1.0) && (fVar7 != 0.0 && fVar7 != 1.0));
        uVar148 = -(uint)((fVar4 != 0.0 && fVar4 != 1.0) && (fVar8 != 0.0 && fVar8 != 1.0));
        auVar152._0_4_ = fVar159 + fVar5;
        auVar152._4_4_ = fVar123 + fVar6;
        auVar152._8_4_ = fVar126 + fVar7;
        auVar152._12_4_ = fVar4 + fVar8;
        auVar114 = rcpps(in_XMM7,auVar152);
        fVar45 = auVar114._0_4_;
        fVar60 = auVar114._4_4_;
        fVar61 = auVar114._8_4_;
        fVar38 = auVar114._12_4_;
        auVar114._0_4_ = fVar128 * fVar96;
        auVar114._4_4_ = fVar128 * fVar100;
        auVar114._8_4_ = fVar128 * fVar102;
        auVar114._12_4_ = fVar128 * fVar105;
        auVar153._0_4_ = fVar96 + fVar5;
        auVar153._4_4_ = fVar100 + fVar6;
        auVar153._8_4_ = fVar102 + fVar7;
        auVar153._12_4_ = fVar105 + fVar8;
        auVar75 = rcpps(auVar114,auVar153);
        fVar103 = auVar75._0_4_;
        fVar106 = auVar75._4_4_;
        fVar79 = auVar75._8_4_;
        fVar81 = auVar75._12_4_;
        auVar115._0_4_ = fVar96 * fVar121;
        auVar115._4_4_ = fVar100 * fVar121;
        auVar115._8_4_ = fVar102 * fVar121;
        auVar115._12_4_ = fVar105 * fVar121;
        auVar75._0_4_ = fVar96 + fVar44;
        auVar75._4_4_ = fVar100 + fVar52;
        auVar75._8_4_ = fVar102 + fVar55;
        auVar75._12_4_ = fVar105 + fVar59;
        auVar116 = rcpps(auVar115,auVar75);
        fVar53 = auVar116._0_4_;
        fVar107 = auVar116._4_4_;
        fVar63 = auVar116._8_4_;
        fVar140 = auVar116._12_4_;
        fVar128 = *(float *)(uVar32 + 0x90 + sVar22 * 4);
        fVar96 = *(float *)(uVar32 + 0x120 + sVar22 * 4);
        auVar108._0_4_ = fVar159 + fVar44;
        auVar108._4_4_ = fVar123 + fVar52;
        auVar108._8_4_ = fVar126 + fVar55;
        auVar108._12_4_ = fVar4 + fVar59;
        in_XMM7 = rcpps(auVar116,auVar108);
        fVar56 = in_XMM7._0_4_;
        fVar57 = in_XMM7._4_4_;
        fVar35 = in_XMM7._8_4_;
        fVar42 = in_XMM7._12_4_;
        fVar100 = *(float *)(uVar32 + 0x80 + sVar22 * 4);
        fVar102 = *(float *)(uVar32 + 0xc0 + sVar22 * 4);
        fVar105 = *(float *)(uVar32 + 0x40 + sVar22 * 4);
        fVar146 = *(float *)(uVar32 + sVar22 * 4);
        fVar149 = *(float *)(uVar32 + 0xd0 + sVar22 * 4);
        fVar165 = *(float *)(uVar32 + 0xe0 + sVar22 * 4);
        fVar167 = *(float *)(uVar32 + 0xb0 + sVar22 * 4);
        fVar168 = *(float *)(uVar32 + 0xf0 + sVar22 * 4);
        fVar169 = *(float *)(uVar32 + 0x70 + sVar22 * 4);
        fVar150 = *(float *)(uVar32 + 0x30 + sVar22 * 4);
        fVar155 = *(float *)(uVar32 + 0x20 + sVar22 * 4);
        fVar157 = *(float *)(uVar32 + 0x10 + sVar22 * 4);
        uVar161 = *(uint *)(This.ptr + 4);
        uVar163 = *(uint *)(This.ptr + 8);
        uVar164 = *(uint *)(This.ptr + 0xc);
        *puVar28 = ~*(uint *)This.ptr & *puVar28 |
                   (uint)((fVar150 * fVar62 + fVar169 * fVar43 + fVar167 * fVar83 + fVar168 * fVar95
                          ) * fVar74 * fVar74 * fVar74 +
                          (fVar155 * fVar62 +
                          (float)(~uVar139 & (uint)fVar119 |
                                 (uint)(((1.0 - auVar153._0_4_ * fVar103) * fVar103 + fVar103) *
                                       (fVar5 * fVar119 + auVar114._0_4_)) & uVar139) * fVar43 +
                          (float)(~uVar139 & (uint)fVar121 |
                                 (uint)(((1.0 - auVar75._0_4_ * fVar53) * fVar53 + fVar53) *
                                       (fVar135 * fVar44 + auVar115._0_4_)) & uVar139) * fVar83 +
                          fVar165 * fVar95) * fVar74 * fVar74 * 3.0 * fVar34 +
                          (fVar157 * fVar62 +
                          (float)(~uVar139 & (uint)fVar112 |
                                 (uint)(((1.0 - auVar152._0_4_ * fVar45) * fVar45 + fVar45) *
                                       (fVar124 * fVar5 + fVar159 * fVar112)) & uVar139) * fVar43 +
                          (float)(~uVar139 & (uint)fVar128 |
                                 (uint)(((1.0 - auVar108._0_4_ * fVar56) * fVar56 + fVar56) *
                                       (fVar44 * fVar128 + fVar96 * fVar159)) & uVar139) * fVar83 +
                          fVar149 * fVar95) * fVar74 * 3.0 * fVar34 * fVar34 +
                         (fVar146 * fVar62 + fVar105 * fVar43 + fVar100 * fVar83 + fVar102 * fVar95)
                         * fVar34 * fVar34 * fVar34) & *(uint *)This.ptr;
        puVar28[1] = ~uVar161 & puVar28[1] |
                     (uint)((fVar150 * fVar70 +
                            fVar169 * fVar51 + fVar167 * fVar89 + fVar168 * fVar99) *
                            fVar78 * fVar78 * fVar78 +
                            (fVar155 * fVar70 +
                            (float)(~uVar143 & (uint)fVar119 |
                                   (uint)(((1.0 - auVar153._4_4_ * fVar106) * fVar106 + fVar106) *
                                         (fVar6 * fVar119 + auVar114._4_4_)) & uVar143) * fVar51 +
                            (float)(~uVar143 & (uint)fVar121 |
                                   (uint)(((1.0 - auVar75._4_4_ * fVar107) * fVar107 + fVar107) *
                                         (fVar135 * fVar52 + auVar115._4_4_)) & uVar143) * fVar89 +
                            fVar165 * fVar99) * fVar78 * fVar78 * 3.0 * fVar37 +
                            (fVar157 * fVar70 +
                            (float)(~uVar143 & (uint)fVar112 |
                                   (uint)(((1.0 - auVar152._4_4_ * fVar60) * fVar60 + fVar60) *
                                         (fVar124 * fVar6 + fVar123 * fVar112)) & uVar143) * fVar51
                            + (float)(~uVar143 & (uint)fVar128 |
                                     (uint)(((1.0 - auVar108._4_4_ * fVar57) * fVar57 + fVar57) *
                                           (fVar52 * fVar128 + fVar96 * fVar123)) & uVar143) *
                              fVar89 + fVar149 * fVar99) * fVar78 * 3.0 * fVar37 * fVar37 +
                           (fVar146 * fVar70 +
                           fVar105 * fVar51 + fVar100 * fVar89 + fVar102 * fVar99) *
                           fVar37 * fVar37 * fVar37) & uVar161;
        puVar28[2] = ~uVar163 & puVar28[2] |
                     (uint)((fVar150 * fVar71 +
                            fVar169 * fVar54 + fVar167 * fVar91 + fVar168 * fVar101) *
                            fVar80 * fVar80 * fVar80 +
                            (fVar155 * fVar71 +
                            (float)(~uVar145 & (uint)fVar119 |
                                   (uint)(((1.0 - auVar153._8_4_ * fVar79) * fVar79 + fVar79) *
                                         (fVar7 * fVar119 + auVar114._8_4_)) & uVar145) * fVar54 +
                            (float)(~uVar145 & (uint)fVar121 |
                                   (uint)(((1.0 - auVar75._8_4_ * fVar63) * fVar63 + fVar63) *
                                         (fVar135 * fVar55 + auVar115._8_4_)) & uVar145) * fVar91 +
                            fVar165 * fVar101) * fVar80 * fVar80 * 3.0 * fVar39 +
                            (fVar157 * fVar71 +
                            (float)(~uVar145 & (uint)fVar112 |
                                   (uint)(((1.0 - auVar152._8_4_ * fVar61) * fVar61 + fVar61) *
                                         (fVar124 * fVar7 + fVar126 * fVar112)) & uVar145) * fVar54
                            + (float)(~uVar145 & (uint)fVar128 |
                                     (uint)(((1.0 - auVar108._8_4_ * fVar35) * fVar35 + fVar35) *
                                           (fVar55 * fVar128 + fVar96 * fVar126)) & uVar145) *
                              fVar91 + fVar149 * fVar101) * fVar80 * 3.0 * fVar39 * fVar39 +
                           (fVar146 * fVar71 +
                           fVar105 * fVar54 + fVar100 * fVar91 + fVar102 * fVar101) *
                           fVar39 * fVar39 * fVar39) & uVar163;
        puVar28[3] = ~uVar164 & puVar28[3] |
                     (uint)((fVar150 * fVar72 +
                            fVar169 * fVar58 + fVar167 * fVar93 + fVar168 * fVar104) *
                            fVar82 * fVar82 * fVar82 +
                            (fVar155 * fVar72 +
                            (float)(~uVar148 & (uint)fVar119 |
                                   (uint)(((1.0 - auVar153._12_4_ * fVar81) * fVar81 + fVar81) *
                                         (fVar8 * fVar119 + auVar114._12_4_)) & uVar148) * fVar58 +
                            (float)(~uVar148 & (uint)fVar121 |
                                   (uint)(((1.0 - auVar75._12_4_ * fVar140) * fVar140 + fVar140) *
                                         (fVar135 * fVar59 + auVar115._12_4_)) & uVar148) * fVar93 +
                            fVar165 * fVar104) * fVar82 * fVar82 * 3.0 * fVar41 +
                            (fVar157 * fVar72 +
                            (float)(~uVar148 & (uint)fVar112 |
                                   (uint)(((1.0 - auVar152._12_4_ * fVar38) * fVar38 + fVar38) *
                                         (fVar124 * fVar8 + fVar4 * fVar112)) & uVar148) * fVar58 +
                            (float)(~uVar148 & (uint)fVar128 |
                                   (uint)(((1.0 - auVar108._12_4_ * fVar42) * fVar42 + fVar42) *
                                         (fVar59 * fVar128 + fVar96 * fVar4)) & uVar148) * fVar93 +
                            fVar149 * fVar104) * fVar82 * 3.0 * fVar41 * fVar41 +
                           (fVar146 * fVar72 +
                           fVar105 * fVar58 + fVar100 * fVar93 + fVar102 * fVar104) *
                           fVar41 * fVar41 * fVar41) & uVar164;
        sVar22 = sVar22 + 1;
        puVar28 = puVar28 + lVar13;
      } while (RVar19.ptr != sVar22);
    }
    if (puVar27 != (uint *)0x0) {
      fVar74 = (v->field_0).v[0];
      fVar78 = (v->field_0).v[1];
      fVar80 = (v->field_0).v[2];
      fVar82 = (v->field_0).v[3];
      fVar51 = 1.0 - fVar74;
      fVar58 = 1.0 - fVar78;
      fVar70 = 1.0 - fVar80;
      fVar72 = 1.0 - fVar82;
      fVar128 = fVar51 * fVar51;
      fVar135 = fVar58 * fVar58;
      fVar96 = fVar70 * fVar70;
      fVar100 = fVar72 * fVar72;
      fVar102 = fVar74 * fVar74;
      fVar105 = fVar78 * fVar78;
      fVar146 = fVar80 * fVar80;
      fVar149 = fVar82 * fVar82;
      fVar83 = fVar102 * 3.0;
      fVar89 = fVar105 * 3.0;
      fVar91 = fVar146 * 3.0;
      fVar93 = fVar149 * 3.0;
      fVar95 = *(float *)depth;
      fVar99 = *(float *)(depth + 4);
      fVar101 = *(float *)(depth + 8);
      fVar104 = *(float *)(depth + 0xc);
      fVar34 = 1.0 - fVar95;
      fVar37 = 1.0 - fVar99;
      fVar39 = 1.0 - fVar101;
      fVar41 = 1.0 - fVar104;
      fVar43 = fVar34 * fVar34;
      fVar54 = fVar37 * fVar37;
      fVar62 = fVar39 * fVar39;
      fVar71 = fVar41 * fVar41;
      fVar165 = fVar95 * fVar95;
      fVar167 = fVar99 * fVar99;
      fVar168 = fVar101 * fVar101;
      fVar169 = fVar104 * fVar104;
      fVar112 = fVar165 * 3.0;
      fVar119 = fVar167 * 3.0;
      fVar121 = fVar168 * 3.0;
      fVar124 = fVar169 * 3.0;
      if (RVar19.ptr != 0) {
        fVar51 = fVar74 * fVar51 + fVar74 * fVar51;
        fVar58 = fVar78 * fVar58 + fVar78 * fVar58;
        fVar70 = fVar80 * fVar70 + fVar80 * fVar70;
        fVar72 = fVar82 * fVar72 + fVar82 * fVar72;
        fVar74 = fVar34 * fVar43;
        fVar78 = fVar37 * fVar54;
        fVar80 = fVar39 * fVar62;
        fVar82 = fVar41 * fVar71;
        fVar43 = fVar95 * 3.0 * fVar43;
        fVar54 = fVar99 * 3.0 * fVar54;
        fVar62 = fVar101 * 3.0 * fVar62;
        fVar71 = fVar104 * 3.0 * fVar71;
        fVar112 = fVar112 * fVar34;
        fVar119 = fVar119 * fVar37;
        fVar121 = fVar121 * fVar39;
        fVar124 = fVar124 * fVar41;
        fVar165 = fVar165 * fVar95;
        fVar167 = fVar167 * fVar99;
        fVar168 = fVar168 * fVar101;
        fVar169 = fVar169 * fVar104;
        sVar22 = 0;
        do {
          fVar44 = (v->field_0).v[0];
          fVar52 = (v->field_0).v[1];
          fVar55 = (v->field_0).v[2];
          fVar59 = (v->field_0).v[3];
          fVar103 = *(float *)depth;
          fVar106 = *(float *)(depth + 4);
          fVar79 = *(float *)(depth + 8);
          fVar81 = *(float *)(depth + 0xc);
          auVar116._0_12_ = ZEXT812(0);
          auVar116._12_4_ = 0;
          fVar95 = *(float *)(uVar32 + 0x50 + sVar22 * 4);
          fVar99 = *(float *)(uVar32 + 0x60 + sVar22 * 4);
          fVar101 = *(float *)(uVar32 + 0xa0 + sVar22 * 4);
          fVar104 = *(float *)(uVar32 + 0x100 + sVar22 * 4);
          fVar34 = *(float *)(uVar32 + 0x110 + sVar22 * 4);
          fVar37 = *(float *)(uVar32 + 0x130 + sVar22 * 4);
          fVar113 = 1.0 - fVar44;
          fVar120 = 1.0 - fVar52;
          fVar122 = 1.0 - fVar55;
          fVar125 = 1.0 - fVar59;
          fVar45 = 1.0 - fVar103;
          fVar53 = 1.0 - fVar106;
          fVar56 = 1.0 - fVar79;
          fVar60 = 1.0 - fVar81;
          uVar139 = -(uint)((fVar44 != 0.0 && fVar44 != 1.0) && (fVar103 != 0.0 && fVar103 != 1.0));
          uVar143 = -(uint)((fVar52 != 0.0 && fVar52 != 1.0) && (fVar106 != 0.0 && fVar106 != 1.0));
          uVar145 = -(uint)((fVar55 != 0.0 && fVar55 != 1.0) && (fVar79 != 0.0 && fVar79 != 1.0));
          uVar148 = -(uint)((fVar59 != 0.0 && fVar59 != 1.0) && (fVar81 != 0.0 && fVar81 != 1.0));
          auVar130._0_4_ = fVar44 + fVar103;
          auVar130._4_4_ = fVar52 + fVar106;
          auVar130._8_4_ = fVar55 + fVar79;
          auVar130._12_4_ = fVar59 + fVar81;
          auVar114 = rcpps(auVar116,auVar130);
          fVar107 = auVar114._0_4_;
          auVar131._0_4_ = auVar130._0_4_ * fVar107;
          fVar63 = auVar114._4_4_;
          auVar131._4_4_ = auVar130._4_4_ * fVar63;
          fVar140 = auVar114._8_4_;
          auVar131._8_4_ = auVar130._8_4_ * fVar140;
          fVar73 = auVar114._12_4_;
          auVar131._12_4_ = auVar130._12_4_ * fVar73;
          auVar97._0_4_ = fVar113 + fVar103;
          auVar97._4_4_ = fVar120 + fVar106;
          auVar97._8_4_ = fVar122 + fVar79;
          auVar97._12_4_ = fVar125 + fVar81;
          auVar114 = rcpps(auVar131,auVar97);
          fVar85 = auVar114._0_4_;
          fVar90 = auVar114._4_4_;
          fVar92 = auVar114._8_4_;
          fVar94 = auVar114._12_4_;
          auVar64._0_4_ = fVar113 * fVar101;
          auVar64._4_4_ = fVar120 * fVar101;
          auVar64._8_4_ = fVar122 * fVar101;
          auVar64._12_4_ = fVar125 * fVar101;
          auVar117._0_4_ = fVar113 + fVar45;
          auVar117._4_4_ = fVar120 + fVar53;
          auVar117._8_4_ = fVar122 + fVar56;
          auVar117._12_4_ = fVar125 + fVar60;
          auVar114 = rcpps(auVar64,auVar117);
          fVar57 = auVar114._0_4_;
          fVar35 = auVar114._4_4_;
          fVar42 = auVar114._8_4_;
          fVar147 = auVar114._12_4_;
          fVar39 = *(float *)(uVar32 + 0x90 + sVar22 * 4);
          fVar41 = *(float *)(uVar32 + 0x120 + sVar22 * 4);
          auVar65._0_4_ = fVar41 * fVar44;
          auVar65._4_4_ = fVar41 * fVar52;
          auVar65._8_4_ = fVar41 * fVar55;
          auVar65._12_4_ = fVar41 * fVar59;
          auVar170._0_4_ = fVar44 + fVar45;
          auVar170._4_4_ = fVar52 + fVar53;
          auVar170._8_4_ = fVar55 + fVar56;
          auVar170._12_4_ = fVar59 + fVar60;
          auVar114 = rcpps(auVar65,auVar170);
          fVar61 = auVar114._0_4_;
          fVar38 = auVar114._4_4_;
          fVar144 = auVar114._8_4_;
          fVar84 = auVar114._12_4_;
          fVar41 = *(float *)(uVar32 + 0x80 + sVar22 * 4);
          fVar150 = *(float *)(uVar32 + 0xc0 + sVar22 * 4);
          fVar155 = *(float *)(uVar32 + 0x40 + sVar22 * 4);
          fVar157 = *(float *)(uVar32 + sVar22 * 4);
          fVar159 = *(float *)(uVar32 + 0xd0 + sVar22 * 4);
          fVar123 = *(float *)(uVar32 + 0xe0 + sVar22 * 4);
          fVar126 = *(float *)(uVar32 + 0x10 + sVar22 * 4);
          fVar4 = *(float *)(uVar32 + 0x20 + sVar22 * 4);
          fVar5 = *(float *)(uVar32 + 0xb0 + sVar22 * 4);
          fVar6 = *(float *)(uVar32 + 0xf0 + sVar22 * 4);
          fVar7 = *(float *)(uVar32 + 0x70 + sVar22 * 4);
          fVar8 = *(float *)(uVar32 + 0x30 + sVar22 * 4);
          uVar161 = *(uint *)(This.ptr + 4);
          uVar163 = *(uint *)(This.ptr + 8);
          uVar164 = *(uint *)(This.ptr + 0xc);
          *puVar27 = ~*(uint *)This.ptr & *puVar27 |
                     (uint)((((fVar8 * fVar74 + fVar7 * fVar43 + fVar5 * fVar112 + fVar6 * fVar165)
                              * fVar83 +
                              (fVar4 * fVar74 +
                              (float)(~uVar139 & (uint)fVar99 |
                                     (uint)(((1.0 - auVar97._0_4_ * fVar85) * fVar85 + fVar85) *
                                           (fVar103 * fVar99 + fVar34 * fVar113)) & uVar139) *
                              fVar43 + (float)(~uVar139 & (uint)fVar101 |
                                              (uint)(((1.0 - auVar117._0_4_ * fVar57) * fVar57 +
                                                     fVar57) * (fVar37 * fVar45 + auVar64._0_4_)) &
                                              uVar139) * fVar112 + fVar123 * fVar165) *
                              (fVar51 - fVar102) * 3.0 +
                             (fVar126 * fVar74 +
                             (float)(~uVar139 & (uint)fVar95 |
                                    (uint)(((1.0 - auVar131._0_4_) * fVar107 + fVar107) *
                                          (fVar104 * fVar103 + fVar44 * fVar95)) & uVar139) * fVar43
                             + (float)(~uVar139 & (uint)fVar39 |
                                      (uint)(((1.0 - auVar170._0_4_ * fVar61) * fVar61 + fVar61) *
                                            (fVar45 * fVar39 + auVar65._0_4_)) & uVar139) * fVar112
                               + fVar159 * fVar165) * (fVar128 - fVar51) * 3.0) -
                            (fVar157 * fVar74 +
                            fVar155 * fVar43 + fVar41 * fVar112 + fVar150 * fVar165) * fVar128 * 3.0
                            ) * dscale) & *(uint *)This.ptr;
          puVar27[1] = ~uVar161 & puVar27[1] |
                       (uint)((((fVar8 * fVar78 + fVar7 * fVar54 + fVar5 * fVar119 + fVar6 * fVar167
                                ) * fVar89 +
                                (fVar4 * fVar78 +
                                (float)(~uVar143 & (uint)fVar99 |
                                       (uint)(((1.0 - auVar97._4_4_ * fVar90) * fVar90 + fVar90) *
                                             (fVar106 * fVar99 + fVar34 * fVar120)) & uVar143) *
                                fVar54 + (float)(~uVar143 & (uint)fVar101 |
                                                (uint)(((1.0 - auVar117._4_4_ * fVar35) * fVar35 +
                                                       fVar35) * (fVar37 * fVar53 + auVar64._4_4_))
                                                & uVar143) * fVar119 + fVar123 * fVar167) *
                                (fVar58 - fVar105) * 3.0 +
                               (fVar126 * fVar78 +
                               (float)(~uVar143 & (uint)fVar95 |
                                      (uint)(((1.0 - auVar131._4_4_) * fVar63 + fVar63) *
                                            (fVar104 * fVar106 + fVar52 * fVar95)) & uVar143) *
                               fVar54 + (float)(~uVar143 & (uint)fVar39 |
                                               (uint)(((1.0 - auVar170._4_4_ * fVar38) * fVar38 +
                                                      fVar38) * (fVar53 * fVar39 + auVar65._4_4_)) &
                                               uVar143) * fVar119 + fVar159 * fVar167) *
                               (fVar135 - fVar58) * 3.0) -
                              (fVar157 * fVar78 +
                              fVar155 * fVar54 + fVar41 * fVar119 + fVar150 * fVar167) *
                              fVar135 * 3.0) * dscale) & uVar161;
          puVar27[2] = ~uVar163 & puVar27[2] |
                       (uint)((((fVar8 * fVar80 + fVar7 * fVar62 + fVar5 * fVar121 + fVar6 * fVar168
                                ) * fVar91 +
                                (fVar4 * fVar80 +
                                (float)(~uVar145 & (uint)fVar99 |
                                       (uint)(((1.0 - auVar97._8_4_ * fVar92) * fVar92 + fVar92) *
                                             (fVar79 * fVar99 + fVar34 * fVar122)) & uVar145) *
                                fVar62 + (float)(~uVar145 & (uint)fVar101 |
                                                (uint)(((1.0 - auVar117._8_4_ * fVar42) * fVar42 +
                                                       fVar42) * (fVar37 * fVar56 + auVar64._8_4_))
                                                & uVar145) * fVar121 + fVar123 * fVar168) *
                                (fVar70 - fVar146) * 3.0 +
                               (fVar126 * fVar80 +
                               (float)(~uVar145 & (uint)fVar95 |
                                      (uint)(((1.0 - auVar131._8_4_) * fVar140 + fVar140) *
                                            (fVar104 * fVar79 + fVar55 * fVar95)) & uVar145) *
                               fVar62 + (float)(~uVar145 & (uint)fVar39 |
                                               (uint)(((1.0 - auVar170._8_4_ * fVar144) * fVar144 +
                                                      fVar144) * (fVar56 * fVar39 + auVar65._8_4_))
                                               & uVar145) * fVar121 + fVar159 * fVar168) *
                               (fVar96 - fVar70) * 3.0) -
                              (fVar157 * fVar80 +
                              fVar155 * fVar62 + fVar41 * fVar121 + fVar150 * fVar168) *
                              fVar96 * 3.0) * dscale) & uVar163;
          puVar27[3] = ~uVar164 & puVar27[3] |
                       (uint)((((fVar8 * fVar82 + fVar7 * fVar71 + fVar5 * fVar124 + fVar6 * fVar169
                                ) * fVar93 +
                                (fVar4 * fVar82 +
                                (float)(~uVar148 & (uint)fVar99 |
                                       (uint)(((1.0 - auVar97._12_4_ * fVar94) * fVar94 + fVar94) *
                                             (fVar81 * fVar99 + fVar34 * fVar125)) & uVar148) *
                                fVar71 + (float)(~uVar148 & (uint)fVar101 |
                                                (uint)(((1.0 - auVar117._12_4_ * fVar147) * fVar147
                                                       + fVar147) *
                                                      (fVar37 * fVar60 + auVar64._12_4_)) & uVar148)
                                         * fVar124 + fVar123 * fVar169) * (fVar72 - fVar149) * 3.0 +
                               (fVar126 * fVar82 +
                               (float)(~uVar148 & (uint)fVar95 |
                                      (uint)(((1.0 - auVar131._12_4_) * fVar73 + fVar73) *
                                            (fVar104 * fVar81 + fVar59 * fVar95)) & uVar148) *
                               fVar71 + (float)(~uVar148 & (uint)fVar39 |
                                               (uint)(((1.0 - auVar170._12_4_ * fVar84) * fVar84 +
                                                      fVar84) * (fVar60 * fVar39 + auVar65._12_4_))
                                               & uVar148) * fVar124 + fVar159 * fVar169) *
                               (fVar100 - fVar72) * 3.0) -
                              (fVar157 * fVar82 +
                              fVar155 * fVar71 + fVar41 * fVar124 + fVar150 * fVar169) *
                              fVar100 * 3.0) * dscale) & uVar164;
          sVar22 = sVar22 + 1;
          puVar27 = puVar27 + lVar13;
        } while (RVar19.ptr != sVar22);
        fVar74 = (v->field_0).v[0];
        fVar78 = (v->field_0).v[1];
        fVar80 = (v->field_0).v[2];
        fVar82 = (v->field_0).v[3];
        fVar95 = *(float *)depth;
        fVar99 = *(float *)(depth + 4);
        fVar101 = *(float *)(depth + 8);
        fVar104 = *(float *)(depth + 0xc);
        fVar51 = 1.0 - fVar74;
        fVar58 = 1.0 - fVar78;
        fVar70 = 1.0 - fVar80;
        fVar72 = 1.0 - fVar82;
        fVar128 = fVar51 * fVar51;
        fVar135 = fVar58 * fVar58;
        fVar96 = fVar70 * fVar70;
        fVar100 = fVar72 * fVar72;
        fVar102 = fVar74 * fVar74;
        fVar105 = fVar78 * fVar78;
        fVar146 = fVar80 * fVar80;
        fVar149 = fVar82 * fVar82;
        fVar83 = fVar102 * 3.0;
        fVar89 = fVar105 * 3.0;
        fVar91 = fVar146 * 3.0;
        fVar93 = fVar149 * 3.0;
        fVar34 = 1.0 - fVar95;
        fVar37 = 1.0 - fVar99;
        fVar39 = 1.0 - fVar101;
        fVar41 = 1.0 - fVar104;
        fVar43 = fVar34 * fVar34;
        fVar54 = fVar37 * fVar37;
        fVar62 = fVar39 * fVar39;
        fVar71 = fVar41 * fVar41;
        fVar165 = fVar95 * fVar95;
        fVar167 = fVar99 * fVar99;
        fVar168 = fVar101 * fVar101;
        fVar169 = fVar104 * fVar104;
        fVar112 = fVar165 * 3.0;
        fVar119 = fVar167 * 3.0;
        fVar121 = fVar168 * 3.0;
        fVar124 = fVar169 * 3.0;
      }
      if (RVar19.ptr != 0) {
        fVar34 = fVar95 * fVar34 + fVar95 * fVar34;
        fVar37 = fVar99 * fVar37 + fVar99 * fVar37;
        fVar39 = fVar101 * fVar39 + fVar101 * fVar39;
        fVar41 = fVar104 * fVar41 + fVar104 * fVar41;
        fVar150 = fVar43 * -3.0;
        fVar155 = fVar54 * -3.0;
        fVar157 = fVar62 * -3.0;
        fVar159 = fVar71 * -3.0;
        fVar95 = (fVar43 - fVar34) * 3.0;
        fVar99 = (fVar54 - fVar37) * 3.0;
        fVar101 = (fVar62 - fVar39) * 3.0;
        fVar104 = (fVar71 - fVar41) * 3.0;
        fVar34 = (fVar34 - fVar165) * 3.0;
        fVar37 = (fVar37 - fVar167) * 3.0;
        fVar39 = (fVar39 - fVar168) * 3.0;
        fVar41 = (fVar41 - fVar169) * 3.0;
        sVar22 = 0;
        do {
          fVar59 = (v->field_0).v[0];
          fVar103 = (v->field_0).v[1];
          fVar106 = (v->field_0).v[2];
          fVar79 = (v->field_0).v[3];
          fVar81 = *(float *)depth;
          fVar45 = *(float *)(depth + 4);
          fVar53 = *(float *)(depth + 8);
          fVar56 = *(float *)(depth + 0xc);
          fVar43 = *(float *)(uVar32 + 0x50 + sVar22 * 4);
          fVar54 = *(float *)(uVar32 + 0x60 + sVar22 * 4);
          auVar127._4_4_ = -(uint)(fVar45 != 0.0);
          auVar127._0_4_ = -(uint)(fVar81 != 0.0);
          auVar127._8_4_ = -(uint)(fVar53 != 0.0);
          auVar127._12_4_ = -(uint)(fVar56 != 0.0);
          fVar62 = *(float *)(uVar32 + 0xa0 + sVar22 * 4);
          fVar71 = *(float *)(uVar32 + 0x100 + sVar22 * 4);
          fVar165 = *(float *)(uVar32 + 0x110 + sVar22 * 4);
          fVar167 = *(float *)(uVar32 + 0x130 + sVar22 * 4);
          fVar168 = 1.0 - fVar59;
          fVar169 = 1.0 - fVar103;
          fVar123 = 1.0 - fVar106;
          fVar126 = 1.0 - fVar79;
          fVar84 = 1.0 - fVar81;
          fVar113 = 1.0 - fVar45;
          fVar120 = 1.0 - fVar53;
          fVar122 = 1.0 - fVar56;
          uVar139 = -(uint)((fVar59 != 0.0 && fVar59 != 1.0) && (fVar81 != 1.0 && fVar81 != 0.0));
          uVar143 = -(uint)((fVar103 != 0.0 && fVar103 != 1.0) && (fVar45 != 1.0 && fVar45 != 0.0));
          uVar145 = -(uint)((fVar106 != 0.0 && fVar106 != 1.0) && (fVar53 != 1.0 && fVar53 != 0.0));
          uVar148 = -(uint)((fVar79 != 0.0 && fVar79 != 1.0) && (fVar56 != 1.0 && fVar56 != 0.0));
          auVar66._0_4_ = fVar59 + fVar81;
          auVar66._4_4_ = fVar103 + fVar45;
          auVar66._8_4_ = fVar106 + fVar53;
          auVar66._12_4_ = fVar79 + fVar56;
          auVar114 = rcpps(auVar127,auVar66);
          fVar125 = auVar114._0_4_;
          fVar85 = auVar114._4_4_;
          fVar90 = auVar114._8_4_;
          fVar92 = auVar114._12_4_;
          auVar46._0_4_ = fVar165 * fVar168;
          auVar46._4_4_ = fVar165 * fVar169;
          auVar46._8_4_ = fVar165 * fVar123;
          auVar46._12_4_ = fVar165 * fVar126;
          auVar67._0_4_ = fVar168 + fVar81;
          auVar67._4_4_ = fVar169 + fVar45;
          auVar67._8_4_ = fVar123 + fVar53;
          auVar67._12_4_ = fVar126 + fVar56;
          auVar114 = rcpps(auVar46,auVar67);
          fVar60 = auVar114._0_4_;
          fVar107 = auVar114._4_4_;
          fVar57 = auVar114._8_4_;
          fVar61 = auVar114._12_4_;
          auVar68._0_4_ = fVar168 * fVar62;
          auVar68._4_4_ = fVar169 * fVar62;
          auVar68._8_4_ = fVar123 * fVar62;
          auVar68._12_4_ = fVar126 * fVar62;
          auVar118._0_4_ = fVar168 + fVar84;
          auVar118._4_4_ = fVar169 + fVar113;
          auVar118._8_4_ = fVar123 + fVar120;
          auVar118._12_4_ = fVar126 + fVar122;
          auVar114 = rcpps(auVar68,auVar118);
          fVar63 = auVar114._0_4_;
          fVar38 = auVar114._4_4_;
          fVar42 = auVar114._8_4_;
          fVar73 = auVar114._12_4_;
          fVar165 = *(float *)(uVar32 + 0x90 + sVar22 * 4);
          fVar168 = *(float *)(uVar32 + 0x120 + sVar22 * 4);
          auVar69._0_4_ = fVar168 * fVar59;
          auVar69._4_4_ = fVar168 * fVar103;
          auVar69._8_4_ = fVar168 * fVar106;
          auVar69._12_4_ = fVar168 * fVar79;
          auVar166._0_4_ = fVar59 + fVar84;
          auVar166._4_4_ = fVar103 + fVar113;
          auVar166._8_4_ = fVar106 + fVar120;
          auVar166._12_4_ = fVar79 + fVar122;
          auVar114 = rcpps(auVar69,auVar166);
          fVar35 = auVar114._0_4_;
          fVar140 = auVar114._4_4_;
          fVar144 = auVar114._8_4_;
          fVar147 = auVar114._12_4_;
          fVar168 = *(float *)(uVar32 + 0x80 + sVar22 * 4);
          fVar169 = *(float *)(uVar32 + 0xc0 + sVar22 * 4);
          fVar123 = *(float *)(uVar32 + 0x40 + sVar22 * 4);
          fVar126 = *(float *)(uVar32 + sVar22 * 4);
          fVar4 = *(float *)(uVar32 + 0xd0 + sVar22 * 4);
          fVar5 = *(float *)(uVar32 + 0xe0 + sVar22 * 4);
          fVar6 = *(float *)(uVar32 + 0x10 + sVar22 * 4);
          fVar7 = *(float *)(uVar32 + 0x20 + sVar22 * 4);
          fVar8 = *(float *)(uVar32 + 0xb0 + sVar22 * 4);
          fVar44 = *(float *)(uVar32 + 0xf0 + sVar22 * 4);
          fVar52 = *(float *)(uVar32 + 0x70 + sVar22 * 4);
          fVar55 = *(float *)(uVar32 + 0x30 + sVar22 * 4);
          uVar161 = *(uint *)(This.ptr + 4);
          uVar163 = *(uint *)(This.ptr + 8);
          uVar164 = *(uint *)(This.ptr + 0xc);
          *puVar26 = ~*(uint *)This.ptr & *puVar26 |
                     (uint)(((fVar55 * fVar150 + fVar52 * fVar95 + fVar8 * fVar34 + fVar44 * fVar112
                             ) * fVar102 * fVar74 +
                             (fVar7 * fVar150 +
                             (float)(~uVar139 & (uint)fVar54 |
                                    (uint)(((1.0 - auVar67._0_4_ * fVar60) * fVar60 + fVar60) *
                                          (fVar81 * fVar54 + auVar46._0_4_)) & uVar139) * fVar95 +
                             (float)(~uVar139 & (uint)fVar62 |
                                    (uint)(((1.0 - auVar118._0_4_ * fVar63) * fVar63 + fVar63) *
                                          (fVar167 * fVar84 + auVar68._0_4_)) & uVar139) * fVar34 +
                             fVar5 * fVar112) * fVar83 * fVar51 +
                             (fVar6 * fVar150 +
                             (float)(~uVar139 & (uint)fVar43 |
                                    (uint)(((1.0 - auVar66._0_4_ * fVar125) * fVar125 + fVar125) *
                                          (fVar71 * fVar81 + fVar59 * fVar43)) & uVar139) * fVar95 +
                             (float)(~uVar139 & (uint)fVar165 |
                                    (uint)(((1.0 - auVar166._0_4_ * fVar35) * fVar35 + fVar35) *
                                          (fVar84 * fVar165 + auVar69._0_4_)) & uVar139) * fVar34 +
                             fVar4 * fVar112) * fVar74 * 3.0 * fVar128 +
                            (fVar126 * fVar150 +
                            fVar123 * fVar95 + fVar168 * fVar34 + fVar169 * fVar112) *
                            fVar51 * fVar128) * dscale) & *(uint *)This.ptr;
          puVar26[1] = ~uVar161 & puVar26[1] |
                       (uint)(((fVar55 * fVar155 +
                               fVar52 * fVar99 + fVar8 * fVar37 + fVar44 * fVar119) *
                               fVar105 * fVar78 +
                               (fVar7 * fVar155 +
                               (float)(~uVar143 & (uint)fVar54 |
                                      (uint)(((1.0 - auVar67._4_4_ * fVar107) * fVar107 + fVar107) *
                                            (fVar45 * fVar54 + auVar46._4_4_)) & uVar143) * fVar99 +
                               (float)(~uVar143 & (uint)fVar62 |
                                      (uint)(((1.0 - auVar118._4_4_ * fVar38) * fVar38 + fVar38) *
                                            (fVar167 * fVar113 + auVar68._4_4_)) & uVar143) * fVar37
                               + fVar5 * fVar119) * fVar89 * fVar58 +
                               (fVar6 * fVar155 +
                               (float)(~uVar143 & (uint)fVar43 |
                                      (uint)(((1.0 - auVar66._4_4_ * fVar85) * fVar85 + fVar85) *
                                            (fVar71 * fVar45 + fVar103 * fVar43)) & uVar143) *
                               fVar99 + (float)(~uVar143 & (uint)fVar165 |
                                               (uint)(((1.0 - auVar166._4_4_ * fVar140) * fVar140 +
                                                      fVar140) * (fVar113 * fVar165 + auVar69._4_4_)
                                                     ) & uVar143) * fVar37 + fVar4 * fVar119) *
                               fVar78 * 3.0 * fVar135 +
                              (fVar126 * fVar155 +
                              fVar123 * fVar99 + fVar168 * fVar37 + fVar169 * fVar119) *
                              fVar58 * fVar135) * dscale) & uVar161;
          puVar26[2] = ~uVar163 & puVar26[2] |
                       (uint)(((fVar55 * fVar157 +
                               fVar52 * fVar101 + fVar8 * fVar39 + fVar44 * fVar121) *
                               fVar146 * fVar80 +
                               (fVar7 * fVar157 +
                               (float)(~uVar145 & (uint)fVar54 |
                                      (uint)(((1.0 - auVar67._8_4_ * fVar57) * fVar57 + fVar57) *
                                            (fVar53 * fVar54 + auVar46._8_4_)) & uVar145) * fVar101
                               + (float)(~uVar145 & (uint)fVar62 |
                                        (uint)(((1.0 - auVar118._8_4_ * fVar42) * fVar42 + fVar42) *
                                              (fVar167 * fVar120 + auVar68._8_4_)) & uVar145) *
                                 fVar39 + fVar5 * fVar121) * fVar91 * fVar70 +
                               (fVar6 * fVar157 +
                               (float)(~uVar145 & (uint)fVar43 |
                                      (uint)(((1.0 - auVar66._8_4_ * fVar90) * fVar90 + fVar90) *
                                            (fVar71 * fVar53 + fVar106 * fVar43)) & uVar145) *
                               fVar101 + (float)(~uVar145 & (uint)fVar165 |
                                                (uint)(((1.0 - auVar166._8_4_ * fVar144) * fVar144 +
                                                       fVar144) *
                                                      (fVar120 * fVar165 + auVar69._8_4_)) & uVar145
                                                ) * fVar39 + fVar4 * fVar121) *
                               fVar80 * 3.0 * fVar96 +
                              (fVar126 * fVar157 +
                              fVar123 * fVar101 + fVar168 * fVar39 + fVar169 * fVar121) *
                              fVar70 * fVar96) * dscale) & uVar163;
          puVar26[3] = ~uVar164 & puVar26[3] |
                       (uint)(((fVar55 * fVar159 +
                               fVar52 * fVar104 + fVar8 * fVar41 + fVar44 * fVar124) *
                               fVar149 * fVar82 +
                               (fVar7 * fVar159 +
                               (float)(~uVar148 & (uint)fVar54 |
                                      (uint)(((1.0 - auVar67._12_4_ * fVar61) * fVar61 + fVar61) *
                                            (fVar56 * fVar54 + auVar46._12_4_)) & uVar148) * fVar104
                               + (float)(~uVar148 & (uint)fVar62 |
                                        (uint)(((1.0 - auVar118._12_4_ * fVar73) * fVar73 + fVar73)
                                              * (fVar167 * fVar122 + auVar68._12_4_)) & uVar148) *
                                 fVar41 + fVar5 * fVar124) * fVar93 * fVar72 +
                               (fVar6 * fVar159 +
                               (float)(~uVar148 & (uint)fVar43 |
                                      (uint)(((1.0 - auVar66._12_4_ * fVar92) * fVar92 + fVar92) *
                                            (fVar71 * fVar56 + fVar79 * fVar43)) & uVar148) *
                               fVar104 + (float)(~uVar148 & (uint)fVar165 |
                                                (uint)(((1.0 - auVar166._12_4_ * fVar147) * fVar147
                                                       + fVar147) *
                                                      (fVar122 * fVar165 + auVar69._12_4_)) &
                                                uVar148) * fVar41 + fVar4 * fVar124) *
                               fVar82 * 3.0 * fVar100 +
                              (fVar126 * fVar159 +
                              fVar123 * fVar104 + fVar168 * fVar41 + fVar169 * fVar124) *
                              fVar72 * fVar100) * dscale) & uVar164;
          sVar22 = sVar22 + 1;
          puVar26 = puVar26 + lVar13;
        } while (RVar19.ptr != sVar22);
      }
    }
    if (puVar25 != (uint *)0x0) {
      fVar74 = (v->field_0).v[0];
      fVar78 = (v->field_0).v[1];
      fVar80 = (v->field_0).v[2];
      fVar82 = (v->field_0).v[3];
      fVar43 = 1.0 - fVar74;
      fVar51 = 1.0 - fVar78;
      fVar54 = 1.0 - fVar80;
      fVar58 = 1.0 - fVar82;
      fVar62 = (float)DAT_01f80e70;
      fVar70 = DAT_01f80e70._4_4_;
      fVar71 = DAT_01f80e70._8_4_;
      fVar72 = DAT_01f80e70._12_4_;
      fVar95 = *(float *)depth;
      fVar99 = *(float *)(depth + 4);
      fVar101 = *(float *)(depth + 8);
      fVar104 = *(float *)(depth + 0xc);
      fVar34 = 1.0 - fVar95;
      fVar37 = 1.0 - fVar99;
      fVar39 = 1.0 - fVar101;
      fVar41 = 1.0 - fVar104;
      if (RVar19.ptr != 0) {
        fVar83 = fVar34 * fVar34 * fVar34;
        fVar91 = fVar37 * fVar37 * fVar37;
        fVar112 = fVar39 * fVar39 * fVar39;
        fVar121 = fVar41 * fVar41 * fVar41;
        fVar89 = fVar95 * 3.0 * fVar34 * fVar34;
        fVar93 = fVar99 * 3.0 * fVar37 * fVar37;
        fVar119 = fVar101 * 3.0 * fVar39 * fVar39;
        fVar124 = fVar104 * 3.0 * fVar41 * fVar41;
        auVar132._0_4_ = fVar95 * fVar95 * fVar95;
        auVar132._4_4_ = fVar99 * fVar99 * fVar99;
        auVar132._8_4_ = fVar101 * fVar101 * fVar101;
        auVar132._12_4_ = fVar104 * fVar104 * fVar104;
        fVar34 = fVar95 * fVar95 * 3.0 * fVar34;
        fVar37 = fVar99 * fVar99 * 3.0 * fVar37;
        fVar39 = fVar101 * fVar101 * 3.0 * fVar39;
        fVar41 = fVar104 * fVar104 * 3.0 * fVar41;
        fVar95 = dscale * dscale;
        sVar22 = 0;
        do {
          fVar126 = (v->field_0).v[0];
          fVar4 = (v->field_0).v[1];
          fVar5 = (v->field_0).v[2];
          fVar6 = (v->field_0).v[3];
          fVar7 = *(float *)depth;
          fVar8 = *(float *)(depth + 4);
          fVar44 = *(float *)(depth + 8);
          fVar52 = *(float *)(depth + 0xc);
          fVar99 = *(float *)(uVar32 + 0x50 + sVar22 * 4);
          fVar101 = *(float *)(uVar32 + 0x60 + sVar22 * 4);
          fVar104 = *(float *)(uVar32 + 0xa0 + sVar22 * 4);
          fVar128 = *(float *)(uVar32 + 0x100 + sVar22 * 4);
          fVar135 = *(float *)(uVar32 + 0x110 + sVar22 * 4);
          fVar96 = *(float *)(uVar32 + 0x130 + sVar22 * 4);
          fVar140 = 1.0 - fVar126;
          fVar144 = 1.0 - fVar4;
          fVar147 = 1.0 - fVar5;
          fVar113 = 1.0 - fVar6;
          fVar55 = 1.0 - fVar7;
          fVar59 = 1.0 - fVar8;
          fVar103 = 1.0 - fVar44;
          fVar106 = 1.0 - fVar52;
          uVar139 = -(uint)((fVar126 != 0.0 && fVar126 != 1.0) && (fVar7 != 0.0 && fVar7 != 1.0));
          uVar143 = -(uint)((fVar4 != 0.0 && fVar4 != 1.0) && (fVar8 != 0.0 && fVar8 != 1.0));
          uVar145 = -(uint)((fVar5 != 0.0 && fVar5 != 1.0) && (fVar44 != 0.0 && fVar44 != 1.0));
          uVar148 = -(uint)((fVar6 != 0.0 && fVar6 != 1.0) && (fVar52 != 0.0 && fVar52 != 1.0));
          auVar86._0_4_ = fVar126 + fVar7;
          auVar86._4_4_ = fVar4 + fVar8;
          auVar86._8_4_ = fVar5 + fVar44;
          auVar86._12_4_ = fVar6 + fVar52;
          auVar114 = rcpps(auVar132,auVar86);
          fVar56 = auVar114._0_4_;
          fVar107 = auVar114._4_4_;
          fVar61 = auVar114._8_4_;
          fVar35 = auVar114._12_4_;
          auVar109._0_4_ = fVar140 + fVar7;
          auVar109._4_4_ = fVar144 + fVar8;
          auVar109._8_4_ = fVar147 + fVar44;
          auVar109._12_4_ = fVar113 + fVar52;
          auVar114 = rcpps(auVar114,auVar109);
          fVar60 = auVar114._0_4_;
          auVar110._0_4_ = auVar109._0_4_ * fVar60;
          fVar57 = auVar114._4_4_;
          auVar110._4_4_ = auVar109._4_4_ * fVar57;
          fVar63 = auVar114._8_4_;
          auVar110._8_4_ = auVar109._8_4_ * fVar63;
          fVar38 = auVar114._12_4_;
          auVar110._12_4_ = auVar109._12_4_ * fVar38;
          auVar141._0_4_ = fVar140 + fVar55;
          auVar141._4_4_ = fVar144 + fVar59;
          auVar141._8_4_ = fVar147 + fVar103;
          auVar141._12_4_ = fVar113 + fVar106;
          auVar114 = rcpps(auVar110,auVar141);
          fVar79 = auVar114._0_4_;
          auVar142._0_4_ = auVar141._0_4_ * fVar79;
          fVar81 = auVar114._4_4_;
          auVar142._4_4_ = auVar141._4_4_ * fVar81;
          fVar45 = auVar114._8_4_;
          auVar142._8_4_ = auVar141._8_4_ * fVar45;
          fVar53 = auVar114._12_4_;
          auVar142._12_4_ = auVar141._12_4_ * fVar53;
          fVar100 = *(float *)(uVar32 + 0x90 + sVar22 * 4);
          fVar102 = *(float *)(uVar32 + 0x120 + sVar22 * 4);
          auVar172._0_4_ = fVar126 + fVar55;
          auVar172._4_4_ = fVar4 + fVar59;
          auVar172._8_4_ = fVar5 + fVar103;
          auVar172._12_4_ = fVar6 + fVar106;
          auVar114 = rcpps(auVar142,auVar172);
          fVar42 = auVar114._0_4_;
          fVar73 = auVar114._4_4_;
          fVar84 = auVar114._8_4_;
          fVar120 = auVar114._12_4_;
          fVar105 = *(float *)(uVar32 + 0x80 + sVar22 * 4);
          fVar146 = *(float *)(uVar32 + 0xc0 + sVar22 * 4);
          fVar149 = *(float *)(uVar32 + 0x40 + sVar22 * 4);
          fVar165 = *(float *)(uVar32 + sVar22 * 4);
          fVar167 = *(float *)(uVar32 + 0xd0 + sVar22 * 4);
          fVar168 = *(float *)(uVar32 + 0xe0 + sVar22 * 4);
          fVar169 = *(float *)(uVar32 + 0x10 + sVar22 * 4);
          fVar150 = *(float *)(uVar32 + 0x20 + sVar22 * 4);
          fVar155 = *(float *)(uVar32 + 0xb0 + sVar22 * 4);
          fVar157 = *(float *)(uVar32 + 0xf0 + sVar22 * 4);
          fVar159 = *(float *)(uVar32 + 0x70 + sVar22 * 4);
          fVar123 = *(float *)(uVar32 + 0x30 + sVar22 * 4);
          uVar161 = *(uint *)(This.ptr + 4);
          uVar163 = *(uint *)(This.ptr + 8);
          uVar164 = *(uint *)(This.ptr + 0xc);
          *puVar25 = ~*(uint *)This.ptr & *puVar25 |
                     (uint)(((fVar123 * fVar83 +
                             fVar159 * fVar89 + fVar155 * fVar34 + fVar157 * auVar132._0_4_) *
                             fVar74 * fVar62 +
                             (fVar150 * fVar83 +
                             (float)(~uVar139 & (uint)fVar101 |
                                    (uint)(((1.0 - auVar110._0_4_) * fVar60 + fVar60) *
                                          (fVar7 * fVar101 + fVar135 * fVar140)) & uVar139) * fVar89
                             + (float)(~uVar139 & (uint)fVar104 |
                                      (uint)(((1.0 - auVar142._0_4_) * fVar79 + fVar79) *
                                            (fVar96 * fVar55 + fVar140 * fVar104)) & uVar139) *
                               fVar34 + fVar168 * auVar132._0_4_) *
                             (fVar43 - (fVar74 + fVar74)) * fVar62 +
                             (fVar169 * fVar83 +
                             (float)(~uVar139 & (uint)fVar99 |
                                    (uint)(((1.0 - auVar86._0_4_ * fVar56) * fVar56 + fVar56) *
                                          (fVar128 * fVar7 + fVar126 * fVar99)) & uVar139) * fVar89
                             + (float)(~uVar139 & (uint)fVar100 |
                                      (uint)(((1.0 - auVar172._0_4_ * fVar42) * fVar42 + fVar42) *
                                            (fVar55 * fVar100 + fVar102 * fVar126)) & uVar139) *
                               fVar34 + fVar167 * auVar132._0_4_) *
                             (fVar74 - (fVar43 + fVar43)) * fVar62 +
                            (fVar165 * fVar83 +
                            fVar149 * fVar89 + fVar105 * fVar34 + fVar146 * auVar132._0_4_) *
                            fVar43 * fVar62) * fVar95) & *(uint *)This.ptr;
          puVar25[1] = ~uVar161 & puVar25[1] |
                       (uint)(((fVar123 * fVar91 +
                               fVar159 * fVar93 + fVar155 * fVar37 + fVar157 * auVar132._4_4_) *
                               fVar78 * fVar70 +
                               (fVar150 * fVar91 +
                               (float)(~uVar143 & (uint)fVar101 |
                                      (uint)(((1.0 - auVar110._4_4_) * fVar57 + fVar57) *
                                            (fVar8 * fVar101 + fVar135 * fVar144)) & uVar143) *
                               fVar93 + (float)(~uVar143 & (uint)fVar104 |
                                               (uint)(((1.0 - auVar142._4_4_) * fVar81 + fVar81) *
                                                     (fVar96 * fVar59 + fVar144 * fVar104)) &
                                               uVar143) * fVar37 + fVar168 * auVar132._4_4_) *
                               (fVar51 - (fVar78 + fVar78)) * fVar70 +
                               (fVar169 * fVar91 +
                               (float)(~uVar143 & (uint)fVar99 |
                                      (uint)(((1.0 - auVar86._4_4_ * fVar107) * fVar107 + fVar107) *
                                            (fVar128 * fVar8 + fVar4 * fVar99)) & uVar143) * fVar93
                               + (float)(~uVar143 & (uint)fVar100 |
                                        (uint)(((1.0 - auVar172._4_4_ * fVar73) * fVar73 + fVar73) *
                                              (fVar59 * fVar100 + fVar102 * fVar4)) & uVar143) *
                                 fVar37 + fVar167 * auVar132._4_4_) *
                               (fVar78 - (fVar51 + fVar51)) * fVar70 +
                              (fVar165 * fVar91 +
                              fVar149 * fVar93 + fVar105 * fVar37 + fVar146 * auVar132._4_4_) *
                              fVar51 * fVar70) * fVar95) & uVar161;
          puVar25[2] = ~uVar163 & puVar25[2] |
                       (uint)(((fVar123 * fVar112 +
                               fVar159 * fVar119 + fVar155 * fVar39 + fVar157 * auVar132._8_4_) *
                               fVar80 * fVar71 +
                               (fVar150 * fVar112 +
                               (float)(~uVar145 & (uint)fVar101 |
                                      (uint)(((1.0 - auVar110._8_4_) * fVar63 + fVar63) *
                                            (fVar44 * fVar101 + fVar135 * fVar147)) & uVar145) *
                               fVar119 + (float)(~uVar145 & (uint)fVar104 |
                                                (uint)(((1.0 - auVar142._8_4_) * fVar45 + fVar45) *
                                                      (fVar96 * fVar103 + fVar147 * fVar104)) &
                                                uVar145) * fVar39 + fVar168 * auVar132._8_4_) *
                               (fVar54 - (fVar80 + fVar80)) * fVar71 +
                               (fVar169 * fVar112 +
                               (float)(~uVar145 & (uint)fVar99 |
                                      (uint)(((1.0 - auVar86._8_4_ * fVar61) * fVar61 + fVar61) *
                                            (fVar128 * fVar44 + fVar5 * fVar99)) & uVar145) *
                               fVar119 + (float)(~uVar145 & (uint)fVar100 |
                                                (uint)(((1.0 - auVar172._8_4_ * fVar84) * fVar84 +
                                                       fVar84) *
                                                      (fVar103 * fVar100 + fVar102 * fVar5)) &
                                                uVar145) * fVar39 + fVar167 * auVar132._8_4_) *
                               (fVar80 - (fVar54 + fVar54)) * fVar71 +
                              (fVar165 * fVar112 +
                              fVar149 * fVar119 + fVar105 * fVar39 + fVar146 * auVar132._8_4_) *
                              fVar54 * fVar71) * fVar95) & uVar163;
          puVar25[3] = ~uVar164 & puVar25[3] |
                       (uint)(((fVar123 * fVar121 +
                               fVar159 * fVar124 + fVar155 * fVar41 + fVar157 * auVar132._12_4_) *
                               fVar82 * fVar72 +
                               (fVar150 * fVar121 +
                               (float)(~uVar148 & (uint)fVar101 |
                                      (uint)(((1.0 - auVar110._12_4_) * fVar38 + fVar38) *
                                            (fVar52 * fVar101 + fVar135 * fVar113)) & uVar148) *
                               fVar124 + (float)(~uVar148 & (uint)fVar104 |
                                                (uint)(((1.0 - auVar142._12_4_) * fVar53 + fVar53) *
                                                      (fVar96 * fVar106 + fVar113 * fVar104)) &
                                                uVar148) * fVar41 + fVar168 * auVar132._12_4_) *
                               (fVar58 - (fVar82 + fVar82)) * fVar72 +
                               (fVar169 * fVar121 +
                               (float)(~uVar148 & (uint)fVar99 |
                                      (uint)(((1.0 - auVar86._12_4_ * fVar35) * fVar35 + fVar35) *
                                            (fVar128 * fVar52 + fVar6 * fVar99)) & uVar148) *
                               fVar124 + (float)(~uVar148 & (uint)fVar100 |
                                                (uint)(((1.0 - auVar172._12_4_ * fVar120) * fVar120
                                                       + fVar120) *
                                                      (fVar106 * fVar100 + fVar102 * fVar6)) &
                                                uVar148) * fVar41 + fVar167 * auVar132._12_4_) *
                               (fVar82 - (fVar58 + fVar58)) * fVar72 +
                              (fVar165 * fVar121 +
                              fVar149 * fVar124 + fVar105 * fVar41 + fVar146 * auVar132._12_4_) *
                              fVar58 * fVar72) * fVar95) & uVar164;
          sVar22 = sVar22 + 1;
          puVar25 = puVar25 + lVar13;
        } while (RVar19.ptr != sVar22);
        fVar74 = (v->field_0).v[0];
        fVar78 = (v->field_0).v[1];
        fVar80 = (v->field_0).v[2];
        fVar82 = (v->field_0).v[3];
        fVar95 = *(float *)depth;
        fVar99 = *(float *)(depth + 4);
        fVar101 = *(float *)(depth + 8);
        fVar104 = *(float *)(depth + 0xc);
        fVar43 = 1.0 - fVar74;
        fVar51 = 1.0 - fVar78;
        fVar54 = 1.0 - fVar80;
        fVar58 = 1.0 - fVar82;
        fVar34 = 1.0 - fVar95;
        fVar37 = 1.0 - fVar99;
        fVar39 = 1.0 - fVar101;
        fVar41 = 1.0 - fVar104;
      }
      auVar154._0_4_ = fVar43 * fVar43;
      auVar154._4_4_ = fVar51 * fVar51;
      auVar154._8_4_ = fVar54 * fVar54;
      auVar154._12_4_ = fVar58 * fVar58;
      fVar62 = fVar74 * fVar74;
      fVar70 = fVar78 * fVar78;
      fVar71 = fVar80 * fVar80;
      fVar72 = fVar82 * fVar82;
      fVar83 = fVar62 * 3.0;
      fVar89 = fVar70 * 3.0;
      fVar91 = fVar71 * 3.0;
      fVar93 = fVar72 * 3.0;
      if (RVar19.ptr != 0) {
        fVar112 = fVar43 * auVar154._0_4_;
        fVar121 = fVar51 * auVar154._4_4_;
        fVar128 = fVar54 * auVar154._8_4_;
        fVar96 = fVar58 * auVar154._12_4_;
        fVar119 = fVar74 * 3.0 * auVar154._0_4_;
        fVar124 = fVar78 * 3.0 * auVar154._4_4_;
        fVar135 = fVar80 * 3.0 * auVar154._8_4_;
        fVar100 = fVar82 * 3.0 * auVar154._12_4_;
        fVar167 = (float)DAT_01f80e70;
        fVar155 = fVar34 * fVar167;
        fVar168 = DAT_01f80e70._4_4_;
        fVar157 = fVar37 * fVar168;
        fVar169 = DAT_01f80e70._8_4_;
        fVar159 = fVar39 * fVar169;
        fVar150 = DAT_01f80e70._12_4_;
        fVar123 = fVar41 * fVar150;
        fVar102 = (fVar95 - (fVar34 + fVar34)) * fVar167;
        fVar105 = (fVar99 - (fVar37 + fVar37)) * fVar168;
        fVar146 = (fVar101 - (fVar39 + fVar39)) * fVar169;
        fVar149 = (fVar104 - (fVar41 + fVar41)) * fVar150;
        fVar165 = (fVar34 - (fVar95 + fVar95)) * fVar167;
        fVar37 = (fVar37 - (fVar99 + fVar99)) * fVar168;
        fVar39 = (fVar39 - (fVar101 + fVar101)) * fVar169;
        fVar41 = (fVar41 - (fVar104 + fVar104)) * fVar150;
        fVar95 = fVar95 * fVar167;
        fVar99 = fVar99 * fVar168;
        fVar101 = fVar101 * fVar169;
        fVar104 = fVar104 * fVar150;
        fVar34 = dscale * dscale;
        sVar22 = 0;
        auVar77 = _DAT_01f80e70;
        do {
          fVar45 = (v->field_0).v[0];
          fVar53 = (v->field_0).v[1];
          fVar56 = (v->field_0).v[2];
          fVar60 = (v->field_0).v[3];
          fVar107 = *(float *)depth;
          fVar57 = *(float *)(depth + 4);
          fVar61 = *(float *)(depth + 8);
          fVar63 = *(float *)(depth + 0xc);
          fVar167 = *(float *)(uVar32 + 0x50 + sVar22 * 4);
          fVar168 = *(float *)(uVar32 + 0x60 + sVar22 * 4);
          fVar169 = *(float *)(uVar32 + 0xa0 + sVar22 * 4);
          fVar150 = *(float *)(uVar32 + 0x100 + sVar22 * 4);
          fVar126 = *(float *)(uVar32 + 0x110 + sVar22 * 4);
          fVar4 = *(float *)(uVar32 + 0x130 + sVar22 * 4);
          fVar129 = 1.0 - fVar45;
          fVar136 = 1.0 - fVar53;
          fVar137 = 1.0 - fVar56;
          fVar138 = 1.0 - fVar60;
          fVar35 = 1.0 - fVar107;
          fVar38 = 1.0 - fVar57;
          fVar140 = 1.0 - fVar61;
          fVar42 = 1.0 - fVar63;
          uVar161 = -(uint)((fVar45 != 0.0 && fVar45 != 1.0) && (fVar107 != 0.0 && fVar107 != 1.0));
          uVar163 = -(uint)((fVar53 != 0.0 && fVar53 != 1.0) && (fVar57 != 0.0 && fVar57 != 1.0));
          uVar164 = -(uint)((fVar56 != 0.0 && fVar56 != 1.0) && (fVar61 != 0.0 && fVar61 != 1.0));
          uVar139 = -(uint)((fVar60 != 0.0 && fVar60 != 1.0) && (fVar63 != 0.0 && fVar63 != 1.0));
          auVar47._0_4_ = fVar45 + fVar107;
          auVar47._4_4_ = fVar53 + fVar57;
          auVar47._8_4_ = fVar56 + fVar61;
          auVar47._12_4_ = fVar60 + fVar63;
          auVar114 = rcpps(auVar154,auVar47);
          fVar151 = auVar114._0_4_;
          fVar156 = auVar114._4_4_;
          fVar158 = auVar114._8_4_;
          fVar160 = auVar114._12_4_;
          auVar87._0_4_ = fVar126 * fVar129;
          auVar87._4_4_ = fVar126 * fVar136;
          auVar87._8_4_ = fVar126 * fVar137;
          auVar87._12_4_ = fVar126 * fVar138;
          auVar48._0_4_ = fVar129 + fVar107;
          auVar48._4_4_ = fVar136 + fVar57;
          auVar48._8_4_ = fVar137 + fVar61;
          auVar48._12_4_ = fVar138 + fVar63;
          auVar114 = rcpps(auVar87,auVar48);
          fVar85 = auVar114._0_4_;
          fVar90 = auVar114._4_4_;
          fVar92 = auVar114._8_4_;
          fVar94 = auVar114._12_4_;
          auVar133._0_4_ = fVar129 + fVar35;
          auVar133._4_4_ = fVar136 + fVar38;
          auVar133._8_4_ = fVar137 + fVar140;
          auVar133._12_4_ = fVar138 + fVar42;
          auVar114 = rcpps(auVar77,auVar133);
          fVar144 = auVar114._0_4_;
          fVar147 = auVar114._4_4_;
          fVar113 = auVar114._8_4_;
          fVar122 = auVar114._12_4_;
          fVar126 = *(float *)(uVar32 + 0x90 + sVar22 * 4);
          fVar5 = *(float *)(uVar32 + 0x120 + sVar22 * 4);
          auVar76._0_4_ = fVar5 * fVar45;
          auVar76._4_4_ = fVar5 * fVar53;
          auVar76._8_4_ = fVar5 * fVar56;
          auVar76._12_4_ = fVar5 * fVar60;
          auVar171._0_4_ = fVar45 + fVar35;
          auVar171._4_4_ = fVar53 + fVar38;
          auVar171._8_4_ = fVar56 + fVar140;
          auVar171._12_4_ = fVar60 + fVar42;
          auVar114 = rcpps(auVar76,auVar171);
          fVar73 = auVar114._0_4_;
          fVar84 = auVar114._4_4_;
          fVar120 = auVar114._8_4_;
          fVar125 = auVar114._12_4_;
          fVar5 = *(float *)(uVar32 + 0x80 + sVar22 * 4);
          fVar6 = *(float *)(uVar32 + 0xc0 + sVar22 * 4);
          auVar154._4_4_ = fVar37;
          auVar154._0_4_ = fVar165;
          auVar154._8_4_ = fVar39;
          auVar154._12_4_ = fVar41;
          fVar7 = *(float *)(uVar32 + 0x40 + sVar22 * 4);
          fVar8 = *(float *)(uVar32 + sVar22 * 4);
          fVar44 = *(float *)(uVar32 + 0xd0 + sVar22 * 4);
          fVar52 = *(float *)(uVar32 + 0xe0 + sVar22 * 4);
          fVar55 = *(float *)(uVar32 + 0x10 + sVar22 * 4);
          fVar59 = *(float *)(uVar32 + 0x20 + sVar22 * 4);
          fVar103 = *(float *)(uVar32 + 0xb0 + sVar22 * 4);
          fVar106 = *(float *)(uVar32 + 0xf0 + sVar22 * 4);
          fVar79 = *(float *)(uVar32 + 0x70 + sVar22 * 4);
          fVar81 = *(float *)(uVar32 + 0x30 + sVar22 * 4);
          auVar77._0_4_ =
               (uint)(((fVar81 * fVar155 + fVar79 * fVar102 + fVar103 * fVar165 + fVar106 * fVar95)
                       * fVar62 * fVar74 +
                       (fVar59 * fVar155 +
                       (float)(~uVar161 & (uint)fVar168 |
                              (uint)(((1.0 - auVar48._0_4_ * fVar85) * fVar85 + fVar85) *
                                    (fVar107 * fVar168 + auVar87._0_4_)) & uVar161) * fVar102 +
                       (float)(~uVar161 & (uint)fVar169 |
                              (uint)(((1.0 - auVar133._0_4_ * fVar144) * fVar144 + fVar144) *
                                    (fVar4 * fVar35 + fVar129 * fVar169)) & uVar161) * fVar165 +
                       fVar52 * fVar95) * fVar83 * fVar43 +
                       (fVar55 * fVar155 +
                       (float)(~uVar161 & (uint)fVar167 |
                              (uint)(((1.0 - auVar47._0_4_ * fVar151) * fVar151 + fVar151) *
                                    (fVar150 * fVar107 + fVar45 * fVar167)) & uVar161) * fVar102 +
                       (float)(~uVar161 & (uint)fVar126 |
                              (uint)(((1.0 - auVar171._0_4_ * fVar73) * fVar73 + fVar73) *
                                    (fVar35 * fVar126 + auVar76._0_4_)) & uVar161) * fVar165 +
                       fVar44 * fVar95) * fVar119 +
                      (fVar8 * fVar155 + fVar7 * fVar102 + fVar5 * fVar165 + fVar6 * fVar95) *
                      fVar112) * fVar34) & *(uint *)This.ptr;
          auVar77._4_4_ =
               (uint)(((fVar81 * fVar157 + fVar79 * fVar105 + fVar103 * fVar37 + fVar106 * fVar99) *
                       fVar70 * fVar78 +
                       (fVar59 * fVar157 +
                       (float)(~uVar163 & (uint)fVar168 |
                              (uint)(((1.0 - auVar48._4_4_ * fVar90) * fVar90 + fVar90) *
                                    (fVar57 * fVar168 + auVar87._4_4_)) & uVar163) * fVar105 +
                       (float)(~uVar163 & (uint)fVar169 |
                              (uint)(((1.0 - auVar133._4_4_ * fVar147) * fVar147 + fVar147) *
                                    (fVar4 * fVar38 + fVar136 * fVar169)) & uVar163) * fVar37 +
                       fVar52 * fVar99) * fVar89 * fVar51 +
                       (fVar55 * fVar157 +
                       (float)(~uVar163 & (uint)fVar167 |
                              (uint)(((1.0 - auVar47._4_4_ * fVar156) * fVar156 + fVar156) *
                                    (fVar150 * fVar57 + fVar53 * fVar167)) & uVar163) * fVar105 +
                       (float)(~uVar163 & (uint)fVar126 |
                              (uint)(((1.0 - auVar171._4_4_ * fVar84) * fVar84 + fVar84) *
                                    (fVar38 * fVar126 + auVar76._4_4_)) & uVar163) * fVar37 +
                       fVar44 * fVar99) * fVar124 +
                      (fVar8 * fVar157 + fVar7 * fVar105 + fVar5 * fVar37 + fVar6 * fVar99) *
                      fVar121) * fVar34) & *(uint *)(This.ptr + 4);
          auVar77._8_4_ =
               (uint)(((fVar81 * fVar159 + fVar79 * fVar146 + fVar103 * fVar39 + fVar106 * fVar101)
                       * fVar71 * fVar80 +
                       (fVar59 * fVar159 +
                       (float)(~uVar164 & (uint)fVar168 |
                              (uint)(((1.0 - auVar48._8_4_ * fVar92) * fVar92 + fVar92) *
                                    (fVar61 * fVar168 + auVar87._8_4_)) & uVar164) * fVar146 +
                       (float)(~uVar164 & (uint)fVar169 |
                              (uint)(((1.0 - auVar133._8_4_ * fVar113) * fVar113 + fVar113) *
                                    (fVar4 * fVar140 + fVar137 * fVar169)) & uVar164) * fVar39 +
                       fVar52 * fVar101) * fVar91 * fVar54 +
                       (fVar55 * fVar159 +
                       (float)(~uVar164 & (uint)fVar167 |
                              (uint)(((1.0 - auVar47._8_4_ * fVar158) * fVar158 + fVar158) *
                                    (fVar150 * fVar61 + fVar56 * fVar167)) & uVar164) * fVar146 +
                       (float)(~uVar164 & (uint)fVar126 |
                              (uint)(((1.0 - auVar171._8_4_ * fVar120) * fVar120 + fVar120) *
                                    (fVar140 * fVar126 + auVar76._8_4_)) & uVar164) * fVar39 +
                       fVar44 * fVar101) * fVar135 +
                      (fVar8 * fVar159 + fVar7 * fVar146 + fVar5 * fVar39 + fVar6 * fVar101) *
                      fVar128) * fVar34) & *(uint *)(This.ptr + 8);
          auVar77._12_4_ =
               (uint)(((fVar81 * fVar123 + fVar79 * fVar149 + fVar103 * fVar41 + fVar106 * fVar104)
                       * fVar72 * fVar82 +
                       (fVar59 * fVar123 +
                       (float)(~uVar139 & (uint)fVar168 |
                              (uint)(((1.0 - auVar48._12_4_ * fVar94) * fVar94 + fVar94) *
                                    (fVar63 * fVar168 + auVar87._12_4_)) & uVar139) * fVar149 +
                       (float)(~uVar139 & (uint)fVar169 |
                              (uint)(((1.0 - auVar133._12_4_ * fVar122) * fVar122 + fVar122) *
                                    (fVar4 * fVar42 + fVar138 * fVar169)) & uVar139) * fVar41 +
                       fVar52 * fVar104) * fVar93 * fVar58 +
                       (fVar55 * fVar123 +
                       (float)(~uVar139 & (uint)fVar167 |
                              (uint)(((1.0 - auVar47._12_4_ * fVar160) * fVar160 + fVar160) *
                                    (fVar150 * fVar63 + fVar60 * fVar167)) & uVar139) * fVar149 +
                       (float)(~uVar139 & (uint)fVar126 |
                              (uint)(((1.0 - auVar171._12_4_ * fVar125) * fVar125 + fVar125) *
                                    (fVar42 * fVar126 + auVar76._12_4_)) & uVar139) * fVar41 +
                       fVar44 * fVar104) * fVar100 +
                      (fVar8 * fVar123 + fVar7 * fVar149 + fVar5 * fVar41 + fVar6 * fVar104) *
                      fVar96) * fVar34) & *(uint *)(This.ptr + 0xc);
          auVar36._0_4_ = ~*(uint *)This.ptr & *(uint *)*pauVar24;
          auVar36._4_4_ = ~*(uint *)(This.ptr + 4) & *(uint *)(*pauVar24 + 4);
          auVar36._8_4_ = ~*(uint *)(This.ptr + 8) & *(uint *)(*pauVar24 + 8);
          auVar36._12_4_ = ~*(uint *)(This.ptr + 0xc) & *(uint *)(*pauVar24 + 0xc);
          *pauVar24 = auVar36 | auVar77;
          sVar22 = sVar22 + 1;
          pauVar24 = (undefined1 (*) [16])(*pauVar24 + lVar13 * 4);
        } while (RVar19.ptr != sVar22);
        fVar74 = (v->field_0).v[0];
        fVar78 = (v->field_0).v[1];
        fVar80 = (v->field_0).v[2];
        fVar82 = (v->field_0).v[3];
        fVar95 = *(float *)depth;
        fVar99 = *(float *)(depth + 4);
        fVar101 = *(float *)(depth + 8);
        fVar104 = *(float *)(depth + 0xc);
        fVar43 = 1.0 - fVar74;
        fVar51 = 1.0 - fVar78;
        fVar54 = 1.0 - fVar80;
        fVar58 = 1.0 - fVar82;
        auVar154._0_4_ = fVar43 * fVar43;
        auVar154._4_4_ = fVar51 * fVar51;
        auVar154._8_4_ = fVar54 * fVar54;
        auVar154._12_4_ = fVar58 * fVar58;
        fVar62 = fVar74 * fVar74;
        fVar70 = fVar78 * fVar78;
        fVar71 = fVar80 * fVar80;
        fVar72 = fVar82 * fVar82;
        fVar83 = fVar62 * 3.0;
        fVar89 = fVar70 * 3.0;
        fVar91 = fVar71 * 3.0;
        fVar93 = fVar72 * 3.0;
        fVar34 = 1.0 - fVar95;
        fVar37 = 1.0 - fVar99;
        fVar39 = 1.0 - fVar101;
        fVar41 = 1.0 - fVar104;
      }
      if (RVar19.ptr != 0) {
        fVar112 = fVar74 * fVar43 + fVar74 * fVar43;
        fVar119 = fVar78 * fVar51 + fVar78 * fVar51;
        fVar54 = fVar80 * fVar54 + fVar80 * fVar54;
        fVar58 = fVar82 * fVar58 + fVar82 * fVar58;
        fVar74 = fVar95 * fVar34 + fVar95 * fVar34;
        fVar80 = fVar99 * fVar37 + fVar99 * fVar37;
        fVar82 = fVar101 * fVar39 + fVar101 * fVar39;
        fVar43 = fVar104 * fVar41 + fVar104 * fVar41;
        fVar121 = fVar34 * fVar34 * -3.0;
        fVar124 = fVar37 * fVar37 * -3.0;
        fVar128 = fVar39 * fVar39 * -3.0;
        fVar135 = fVar41 * fVar41 * -3.0;
        fVar51 = (fVar34 * fVar34 - fVar74) * 3.0;
        fVar37 = (fVar37 * fVar37 - fVar80) * 3.0;
        fVar39 = (fVar39 * fVar39 - fVar82) * 3.0;
        fVar41 = (fVar41 * fVar41 - fVar43) * 3.0;
        fVar78 = (fVar74 - fVar95 * fVar95) * 3.0;
        fVar80 = (fVar80 - fVar99 * fVar99) * 3.0;
        fVar82 = (fVar82 - fVar101 * fVar101) * 3.0;
        fVar34 = (fVar43 - fVar104 * fVar104) * 3.0;
        auVar134._0_4_ = fVar95 * fVar95 * 3.0;
        auVar134._4_4_ = fVar99 * fVar99 * 3.0;
        auVar134._8_4_ = fVar101 * fVar101 * 3.0;
        auVar134._12_4_ = fVar104 * fVar104 * 3.0;
        fVar74 = dscale * dscale;
        sVar22 = 0;
        do {
          fVar123 = (v->field_0).v[0];
          fVar126 = (v->field_0).v[1];
          fVar4 = (v->field_0).v[2];
          fVar5 = (v->field_0).v[3];
          fVar6 = *(float *)depth;
          fVar7 = *(float *)(depth + 4);
          fVar8 = *(float *)(depth + 8);
          fVar44 = *(float *)(depth + 0xc);
          fVar95 = *(float *)(uVar32 + 0x50 + sVar22 * 4);
          fVar99 = *(float *)(uVar32 + 0x60 + sVar22 * 4);
          auVar111._4_4_ = -(uint)(fVar7 != 0.0);
          auVar111._0_4_ = -(uint)(fVar6 != 0.0);
          auVar111._8_4_ = -(uint)(fVar8 != 0.0);
          auVar111._12_4_ = -(uint)(fVar44 != 0.0);
          fVar101 = *(float *)(uVar32 + 0xa0 + sVar22 * 4);
          fVar104 = *(float *)(uVar32 + 0x100 + sVar22 * 4);
          fVar43 = *(float *)(uVar32 + 0x110 + sVar22 * 4);
          fVar96 = *(float *)(uVar32 + 0x130 + sVar22 * 4);
          fVar53 = 1.0 - fVar123;
          fVar56 = 1.0 - fVar126;
          fVar60 = 1.0 - fVar4;
          fVar107 = 1.0 - fVar5;
          fVar52 = 1.0 - fVar6;
          fVar55 = 1.0 - fVar7;
          fVar59 = 1.0 - fVar8;
          fVar103 = 1.0 - fVar44;
          uVar139 = -(uint)((fVar123 != 0.0 && fVar123 != 1.0) && (fVar6 != 1.0 && fVar6 != 0.0));
          uVar143 = -(uint)((fVar126 != 0.0 && fVar126 != 1.0) && (fVar7 != 1.0 && fVar7 != 0.0));
          uVar145 = -(uint)((fVar4 != 0.0 && fVar4 != 1.0) && (fVar8 != 1.0 && fVar8 != 0.0));
          uVar148 = -(uint)((fVar5 != 0.0 && fVar5 != 1.0) && (fVar44 != 1.0 && fVar44 != 0.0));
          auVar49._0_4_ = fVar123 + fVar6;
          auVar49._4_4_ = fVar126 + fVar7;
          auVar49._8_4_ = fVar4 + fVar8;
          auVar49._12_4_ = fVar5 + fVar44;
          auVar114 = rcpps(auVar111,auVar49);
          fVar57 = auVar114._0_4_;
          fVar61 = auVar114._4_4_;
          fVar63 = auVar114._8_4_;
          fVar35 = auVar114._12_4_;
          auVar88._0_4_ = fVar43 * fVar53;
          auVar88._4_4_ = fVar43 * fVar56;
          auVar88._8_4_ = fVar43 * fVar60;
          auVar88._12_4_ = fVar43 * fVar107;
          auVar50._0_4_ = fVar53 + fVar6;
          auVar50._4_4_ = fVar56 + fVar7;
          auVar50._8_4_ = fVar60 + fVar8;
          auVar50._12_4_ = fVar107 + fVar44;
          auVar114 = rcpps(auVar88,auVar50);
          fVar106 = auVar114._0_4_;
          fVar79 = auVar114._4_4_;
          fVar81 = auVar114._8_4_;
          fVar45 = auVar114._12_4_;
          auVar98._0_4_ = fVar53 + fVar52;
          auVar98._4_4_ = fVar56 + fVar55;
          auVar98._8_4_ = fVar60 + fVar59;
          auVar98._12_4_ = fVar107 + fVar103;
          auVar114 = rcpps(auVar134,auVar98);
          fVar38 = auVar114._0_4_;
          fVar42 = auVar114._4_4_;
          fVar73 = auVar114._8_4_;
          fVar84 = auVar114._12_4_;
          fVar43 = *(float *)(uVar32 + 0x90 + sVar22 * 4);
          fVar100 = *(float *)(uVar32 + 0x120 + sVar22 * 4);
          auVar162._0_4_ = fVar123 + fVar52;
          auVar162._4_4_ = fVar126 + fVar55;
          auVar162._8_4_ = fVar4 + fVar59;
          auVar162._12_4_ = fVar5 + fVar103;
          auVar114 = rcpps(auVar114,auVar162);
          fVar140 = auVar114._0_4_;
          fVar144 = auVar114._4_4_;
          fVar147 = auVar114._8_4_;
          fVar113 = auVar114._12_4_;
          fVar102 = *(float *)(uVar32 + 0x80 + sVar22 * 4);
          fVar105 = *(float *)(uVar32 + 0xc0 + sVar22 * 4);
          fVar146 = *(float *)(uVar32 + 0x40 + sVar22 * 4);
          fVar149 = *(float *)(uVar32 + sVar22 * 4);
          fVar165 = *(float *)(uVar32 + 0xd0 + sVar22 * 4);
          fVar167 = *(float *)(uVar32 + 0xe0 + sVar22 * 4);
          fVar168 = *(float *)(uVar32 + 0x10 + sVar22 * 4);
          fVar169 = *(float *)(uVar32 + 0x20 + sVar22 * 4);
          fVar150 = *(float *)(uVar32 + 0xb0 + sVar22 * 4);
          fVar155 = *(float *)(uVar32 + 0xf0 + sVar22 * 4);
          fVar157 = *(float *)(uVar32 + 0x70 + sVar22 * 4);
          fVar159 = *(float *)(uVar32 + 0x30 + sVar22 * 4);
          uVar161 = *(uint *)(This.ptr + 4);
          uVar163 = *(uint *)(This.ptr + 8);
          uVar164 = *(uint *)(This.ptr + 0xc);
          *puVar18 = ~*(uint *)This.ptr & *puVar18 |
                     (uint)((((fVar159 * fVar121 +
                              fVar157 * fVar51 + fVar150 * fVar78 + fVar155 * auVar134._0_4_) *
                              fVar83 + (fVar169 * fVar121 +
                                       (float)(~uVar139 & (uint)fVar99 |
                                              (uint)(((1.0 - auVar50._0_4_ * fVar106) * fVar106 +
                                                     fVar106) * (fVar6 * fVar99 + auVar88._0_4_)) &
                                              uVar139) * fVar51 +
                                       (float)(~uVar139 & (uint)fVar101 |
                                              (uint)(((1.0 - auVar98._0_4_ * fVar38) * fVar38 +
                                                     fVar38) * (fVar96 * fVar52 + fVar53 * fVar101))
                                              & uVar139) * fVar78 + fVar167 * auVar134._0_4_) *
                                       (fVar112 - fVar62) * 3.0 +
                             (fVar168 * fVar121 +
                             (float)(~uVar139 & (uint)fVar95 |
                                    (uint)(((1.0 - auVar49._0_4_ * fVar57) * fVar57 + fVar57) *
                                          (fVar104 * fVar6 + fVar123 * fVar95)) & uVar139) * fVar51
                             + (float)(~uVar139 & (uint)fVar43 |
                                      (uint)(((1.0 - auVar162._0_4_ * fVar140) * fVar140 + fVar140)
                                            * (fVar52 * fVar43 + fVar100 * fVar123)) & uVar139) *
                               fVar78 + fVar165 * auVar134._0_4_) * (auVar154._0_4_ - fVar112) * 3.0
                             ) - (fVar149 * fVar121 +
                                 fVar146 * fVar51 + fVar102 * fVar78 + fVar105 * auVar134._0_4_) *
                                 auVar154._0_4_ * 3.0) * fVar74) & *(uint *)This.ptr;
          puVar18[1] = ~uVar161 & puVar18[1] |
                       (uint)((((fVar159 * fVar124 +
                                fVar157 * fVar37 + fVar150 * fVar80 + fVar155 * auVar134._4_4_) *
                                fVar89 + (fVar169 * fVar124 +
                                         (float)(~uVar143 & (uint)fVar99 |
                                                (uint)(((1.0 - auVar50._4_4_ * fVar79) * fVar79 +
                                                       fVar79) * (fVar7 * fVar99 + auVar88._4_4_)) &
                                                uVar143) * fVar37 +
                                         (float)(~uVar143 & (uint)fVar101 |
                                                (uint)(((1.0 - auVar98._4_4_ * fVar42) * fVar42 +
                                                       fVar42) *
                                                      (fVar96 * fVar55 + fVar56 * fVar101)) &
                                                uVar143) * fVar80 + fVar167 * auVar134._4_4_) *
                                         (fVar119 - fVar70) * 3.0 +
                               (fVar168 * fVar124 +
                               (float)(~uVar143 & (uint)fVar95 |
                                      (uint)(((1.0 - auVar49._4_4_ * fVar61) * fVar61 + fVar61) *
                                            (fVar104 * fVar7 + fVar126 * fVar95)) & uVar143) *
                               fVar37 + (float)(~uVar143 & (uint)fVar43 |
                                               (uint)(((1.0 - auVar162._4_4_ * fVar144) * fVar144 +
                                                      fVar144) *
                                                     (fVar55 * fVar43 + fVar100 * fVar126)) &
                                               uVar143) * fVar80 + fVar165 * auVar134._4_4_) *
                               (auVar154._4_4_ - fVar119) * 3.0) -
                              (fVar149 * fVar124 +
                              fVar146 * fVar37 + fVar102 * fVar80 + fVar105 * auVar134._4_4_) *
                              auVar154._4_4_ * 3.0) * fVar74) & uVar161;
          puVar18[2] = ~uVar163 & puVar18[2] |
                       (uint)((((fVar159 * fVar128 +
                                fVar157 * fVar39 + fVar150 * fVar82 + fVar155 * auVar134._8_4_) *
                                fVar91 + (fVar169 * fVar128 +
                                         (float)(~uVar145 & (uint)fVar99 |
                                                (uint)(((1.0 - auVar50._8_4_ * fVar81) * fVar81 +
                                                       fVar81) * (fVar8 * fVar99 + auVar88._8_4_)) &
                                                uVar145) * fVar39 +
                                         (float)(~uVar145 & (uint)fVar101 |
                                                (uint)(((1.0 - auVar98._8_4_ * fVar73) * fVar73 +
                                                       fVar73) *
                                                      (fVar96 * fVar59 + fVar60 * fVar101)) &
                                                uVar145) * fVar82 + fVar167 * auVar134._8_4_) *
                                         (fVar54 - fVar71) * 3.0 +
                               (fVar168 * fVar128 +
                               (float)(~uVar145 & (uint)fVar95 |
                                      (uint)(((1.0 - auVar49._8_4_ * fVar63) * fVar63 + fVar63) *
                                            (fVar104 * fVar8 + fVar4 * fVar95)) & uVar145) * fVar39
                               + (float)(~uVar145 & (uint)fVar43 |
                                        (uint)(((1.0 - auVar162._8_4_ * fVar147) * fVar147 + fVar147
                                               ) * (fVar59 * fVar43 + fVar100 * fVar4)) & uVar145) *
                                 fVar82 + fVar165 * auVar134._8_4_) *
                               (auVar154._8_4_ - fVar54) * 3.0) -
                              (fVar149 * fVar128 +
                              fVar146 * fVar39 + fVar102 * fVar82 + fVar105 * auVar134._8_4_) *
                              auVar154._8_4_ * 3.0) * fVar74) & uVar163;
          puVar18[3] = ~uVar164 & puVar18[3] |
                       (uint)((((fVar159 * fVar135 +
                                fVar157 * fVar41 + fVar150 * fVar34 + fVar155 * auVar134._12_4_) *
                                fVar93 + (fVar169 * fVar135 +
                                         (float)(~uVar148 & (uint)fVar99 |
                                                (uint)(((1.0 - auVar50._12_4_ * fVar45) * fVar45 +
                                                       fVar45) * (fVar44 * fVar99 + auVar88._12_4_))
                                                & uVar148) * fVar41 +
                                         (float)(~uVar148 & (uint)fVar101 |
                                                (uint)(((1.0 - auVar98._12_4_ * fVar84) * fVar84 +
                                                       fVar84) *
                                                      (fVar96 * fVar103 + fVar107 * fVar101)) &
                                                uVar148) * fVar34 + fVar167 * auVar134._12_4_) *
                                         (fVar58 - fVar72) * 3.0 +
                               (fVar168 * fVar135 +
                               (float)(~uVar148 & (uint)fVar95 |
                                      (uint)(((1.0 - auVar49._12_4_ * fVar35) * fVar35 + fVar35) *
                                            (fVar104 * fVar44 + fVar5 * fVar95)) & uVar148) * fVar41
                               + (float)(~uVar148 & (uint)fVar43 |
                                        (uint)(((1.0 - auVar162._12_4_ * fVar113) * fVar113 +
                                               fVar113) * (fVar103 * fVar43 + fVar100 * fVar5)) &
                                        uVar148) * fVar34 + fVar165 * auVar134._12_4_) *
                               (auVar154._12_4_ - fVar58) * 3.0) -
                              (fVar149 * fVar135 +
                              fVar146 * fVar41 + fVar102 * fVar34 + fVar105 * auVar134._12_4_) *
                              auVar154._12_4_ * 3.0) * fVar74) & uVar164;
          sVar22 = sVar22 + 1;
          puVar18 = puVar18 + lVar13;
        } while (RVar19.ptr != sVar22);
      }
    }
    break;
  default:
    goto switchD_00d4e254_caseD_5;
  case 7:
    vVar173 = eval_general(this,valid,(SubdividedGeneralPatch *)This.ptr,
                           (vfloat_impl<4> *)((ulong)u & 0xfffffffffffffff0),v,depth);
    RVar19.ptr = vVar173.field_0._8_8_;
    goto LAB_00d50d37;
  case 8:
    vVar173 = eval_quad(this,valid,(SubdividedQuadPatch *)This.ptr,
                        (vfloat_impl<4> *)((ulong)u & 0xfffffffffffffff0),v,dscale,depth);
    RVar19.ptr = vVar173.field_0._8_8_;
    goto LAB_00d50d37;
  case 9:
    pDVar20 = &local_d80.ring.items[0].ring;
    pDVar23 = &local_d80.ring.items[0].crease_weight;
    lVar13 = 0;
    do {
      *(long *)((long)local_d80.ring.items[0].crease_weight.arr + lVar13 + 0x40) =
           (long)pDVar23->arr + lVar13;
      *(undefined8 *)((long)local_d80.ring.items[0].ring.arr + lVar13 + -0x38) = 0;
      *(long *)((long)&local_d80.ring.items[0].ring.data + lVar13) =
           (long)&pDVar20->arr[0].field_0 + lVar13;
      lVar13 = lVar13 + 0x340;
    } while (lVar13 != 0xd00);
    uVar32 = (ulong)u & 0xfffffffffffffff0;
    lVar31 = 0;
    lVar13 = 0;
    do {
      local_d80.ring.items[lVar31].border_index = *(int *)(uVar32 + lVar13);
      uVar161 = *(uint *)(uVar32 + 4 + lVar13);
      local_d80.ring.items[lVar31].face_valence = uVar161;
      local_d80.ring.items[lVar31].edge_valence = uVar161 * 2;
      local_d80.ring.items[lVar31].vertex_crease_weight = *(float *)(uVar32 + 8 + lVar13);
      lVar13 = lVar13 + 0xc;
      if (uVar161 == 0) {
        bVar33 = true;
      }
      else {
        uVar30 = 0;
        do {
          pfVar14 = local_d80.ring.items[lVar31].crease_weight.data;
          if ((0xf < uVar30) &&
             ((DynamicStackArray<float,_16UL,_64UL> *)pfVar14 ==
              &local_d80.ring.items[lVar31].crease_weight)) {
            pfVar14 = (float *)operator_new__(0x100);
            local_d80.ring.items[lVar31].crease_weight.data = pfVar14;
            lVar16 = 0;
            do {
              local_d80.ring.items[lVar31].crease_weight.data[lVar16] = pDVar23->arr[lVar16];
              lVar16 = lVar16 + 1;
            } while (lVar16 != 0x10);
            pfVar14 = local_d80.ring.items[lVar31].crease_weight.data;
          }
          pfVar14[uVar30] = *(float *)(uVar32 + lVar13);
          uVar30 = uVar30 + 1;
          lVar13 = lVar13 + 4;
        } while (uVar30 < local_d80.ring.items[lVar31].face_valence);
        bVar33 = local_d80.ring.items[lVar31].edge_valence == 0;
      }
      local_d80.ring.items[lVar31].vertex_level = *(float *)(uVar32 + lVar13);
      local_d80.ring.items[lVar31].edge_level = *(float *)(uVar32 + 4 + lVar13);
      local_d80.ring.items[lVar31].eval_start_index = *(uint *)(uVar32 + 8 + lVar13);
      local_d80.ring.items[lVar31].eval_unique_identifier = *(uint *)(uVar32 + 0xc + lVar13);
      puVar3 = (undefined8 *)(uVar32 + 0x10 + lVar13);
      uVar12 = puVar3[1];
      *(undefined8 *)&local_d80.ring.items[lVar31].vtx.field_0 = *puVar3;
      *(undefined8 *)((long)&local_d80.ring.items[lVar31].vtx.field_0 + 8) = uVar12;
      lVar13 = lVar13 + 0x20;
      if (!bVar33) {
        uVar30 = 0;
        do {
          auVar114 = *(undefined1 (*) [16])(uVar32 + lVar13);
          pvVar15 = local_d80.ring.items[lVar31].ring.data;
          if ((0x1f < uVar30) &&
             ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar15 ==
              &local_d80.ring.items[lVar31].ring)) {
            pvVar15 = (vfloat_impl<4> *)alignedMalloc(0x800,0x10);
            local_d80.ring.items[lVar31].ring.data = pvVar15;
            lVar16 = 0;
            do {
              puVar3 = (undefined8 *)((long)&pDVar20->arr[0].field_0 + lVar16);
              uVar12 = puVar3[1];
              puVar2 = (undefined8 *)
                       ((long)&(local_d80.ring.items[lVar31].ring.data)->field_0 + lVar16);
              *puVar2 = *puVar3;
              puVar2[1] = uVar12;
              lVar16 = lVar16 + 0x10;
            } while (lVar16 != 0x200);
            pvVar15 = local_d80.ring.items[lVar31].ring.data;
          }
          uVar1 = uVar30 + 1;
          local_e50 = auVar114._0_8_;
          uStack_e48 = auVar114._8_8_;
          *(undefined8 *)&pvVar15[uVar30].field_0 = local_e50;
          *(undefined8 *)((long)&pvVar15[uVar30].field_0 + 8) = uStack_e48;
          lVar13 = lVar13 + 0x10;
          uVar30 = uVar1;
        } while (uVar1 < local_d80.ring.items[lVar31].edge_valence);
      }
      lVar31 = lVar31 + 1;
      pDVar23 = (DynamicStackArray<float,_16UL,_64UL> *)((long)(pDVar23 + 6) + 0x40);
      pDVar20 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                ((long)(pDVar20 + 1) + 0x100);
    } while (lVar31 != 4);
    local_dc0.P = *(float **)&valid->field_0;
    local_dc0.dPdu = *(float **)((long)&valid->field_0 + 8);
    local_dc0.dPdv = *(float **)&valid[1].field_0;
    local_dc0.ddPdudu = *(float **)((long)&valid[1].field_0 + 8);
    local_dc0.ddPdvdv = *(float **)&valid[2].field_0;
    local_dc0.ddPdudv = *(float **)((long)&valid[2].field_0 + 8);
    local_dc0.dstride = *(size_t *)&valid[3].field_0;
    local_dc0.N = *(size_t *)((long)&valid[3].field_0 + 8);
    local_de0._0_8_ = *(undefined8 *)&v->field_0;
    local_de0._8_8_ = *(undefined8 *)((long)&v->field_0 + 8);
    local_de0._16_8_ = *(undefined8 *)depth;
    local_de0._24_8_ = *(undefined8 *)(depth + 8);
    FeatureAdaptiveEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
    ::eval_direct(&local_dc0,(vboolf_impl<4> *)This.ptr,&local_d80,
                  (Vec2<embree::vfloat_impl<4>_> *)&local_de0.field_0,dscale,in_stack_00000008,
                  (BezierCurve *)0x0,(BezierCurve *)0x0,(BezierCurve *)0x0,(BezierCurve *)0x0);
    pfVar14 = *(float **)(This.ptr + 8);
    this->P = *(float **)This.ptr;
    this->dPdu = pfVar14;
    lVar13 = -0xd00;
    pDVar23 = &local_d80.ring.items[3].crease_weight;
    RVar19.ptr = extraout_RDX_00;
    do {
      pvVar15 = *(vfloat_impl<4> **)((vfloat_impl<4> *)(pDVar23 + 5) + 4);
      if (pvVar15 != (vfloat_impl<4> *)0x0 &&
          (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)((long)(pDVar23 + 1) + 0x40) !=
          (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar15) {
        alignedFree(pvVar15);
        RVar19.ptr = extraout_RDX_01;
      }
      pfVar14 = pDVar23->data;
      if (pfVar14 != (float *)0x0 && pDVar23 != (DynamicStackArray<float,_16UL,_64UL> *)pfVar14) {
        operator_delete__(pfVar14);
        RVar19.ptr = extraout_RDX_02;
      }
      pDVar23 = (DynamicStackArray<float,_16UL,_64UL> *)((long)(pDVar23 + -7) + 0x40);
      lVar13 = lVar13 + 0x340;
    } while (lVar13 != 0);
    goto LAB_00d50d37;
  }
  pfVar14 = *(float **)This.ptr;
  pfVar40 = *(float **)(This.ptr + 8);
LAB_00d50d32:
  this->P = pfVar14;
  this->dPdu = pfVar40;
LAB_00d50d37:
  vVar173.field_0._8_8_ = RVar19.ptr;
  vVar173.field_0._0_8_ = this;
  return (vboolf_impl<4>)vVar173.field_0;
}

Assistant:

vbool eval(const vbool& valid, Ref This, const vfloat& u, const vfloat& v, const float dscale, const size_t depth) 
        {
          if (!This) return false;
          switch (This.type()) 
          {
          case Patch::BILINEAR_PATCH: {
            ((typename Patch::BilinearPatch*)This.object())->patch.eval(valid,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale,dstride,N); 
            return valid;
          }
          case Patch::BSPLINE_PATCH: {
            ((typename Patch::BSplinePatch*)This.object())->patch.eval(valid,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale,dstride,N);
            return valid;
          }
          case Patch::BEZIER_PATCH: {
            ((typename Patch::BezierPatch*)This.object())->patch.eval(valid,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale,dstride,N);
            return valid;
          }
          case Patch::GREGORY_PATCH: {
            ((typename Patch::GregoryPatch*)This.object())->patch.eval(valid,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale,dstride,N); 
            return valid;
          }
          case Patch::SUBDIVIDED_QUAD_PATCH: {
            return eval_quad(valid,((typename Patch::SubdividedQuadPatch*)This.object()),u,v,dscale,depth);
          }
          case Patch::SUBDIVIDED_GENERAL_PATCH: { 
            assert(dscale == 1.0f); 
            return eval_general(valid,((typename Patch::SubdividedGeneralPatch*)This.object()),u,v,depth); 
          }
          case Patch::EVAL_PATCH: { 
            CatmullClarkPatch patch; patch.deserialize(This.object());
            FeatureAdaptiveEvalSimd<vbool,vint,vfloat,Vertex,Vertex_t>(patch,valid,u,v,dscale,depth,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dstride,N);
            return valid;
          }
          default: 
            assert(false); 
            return false;
          }
        }